

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  Geometry *pGVar68;
  long lVar69;
  uint uVar70;
  ulong uVar71;
  byte bVar72;
  ulong uVar73;
  float fVar74;
  float fVar75;
  float fVar126;
  float fVar128;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar85 [16];
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar132;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar130;
  float fVar133;
  float fVar134;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined4 uVar135;
  float fVar145;
  float fVar146;
  vint4 bi_2;
  float fVar147;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined8 uVar148;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar171;
  vint4 bi;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 ai_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  vint4 ai_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  vint4 ai;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_534;
  ulong local_530;
  ulong local_528;
  Precalculations *local_520;
  Primitive *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar64 = (ulong)(byte)PVar7;
  lVar28 = uVar64 * 0x25;
  fVar157 = *(float *)(prim + lVar28 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar158._0_4_ = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar158._4_4_ = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar158._8_4_ = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar158._12_4_ = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar180._0_4_ = fVar157 * auVar81._0_4_;
  auVar180._4_4_ = fVar157 * auVar81._4_4_;
  auVar180._8_4_ = fVar157 * auVar81._8_4_;
  auVar180._12_4_ = fVar157 * auVar81._12_4_;
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar64 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar187._4_4_ = auVar158._0_4_;
  auVar187._0_4_ = auVar158._0_4_;
  auVar187._8_4_ = auVar158._0_4_;
  auVar187._12_4_ = auVar158._0_4_;
  auVar23 = vshufps_avx(auVar158,auVar158,0x55);
  auVar24 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar157 = auVar24._0_4_;
  auVar159._0_4_ = fVar157 * auVar77._0_4_;
  fVar145 = auVar24._4_4_;
  auVar159._4_4_ = fVar145 * auVar77._4_4_;
  fVar146 = auVar24._8_4_;
  auVar159._8_4_ = fVar146 * auVar77._8_4_;
  fVar147 = auVar24._12_4_;
  auVar159._12_4_ = fVar147 * auVar77._12_4_;
  auVar149._0_4_ = auVar78._0_4_ * fVar157;
  auVar149._4_4_ = auVar78._4_4_ * fVar145;
  auVar149._8_4_ = auVar78._8_4_ * fVar146;
  auVar149._12_4_ = auVar78._12_4_ * fVar147;
  auVar85._0_4_ = auVar79._0_4_ * fVar157;
  auVar85._4_4_ = auVar79._4_4_ * fVar145;
  auVar85._8_4_ = auVar79._8_4_ * fVar146;
  auVar85._12_4_ = auVar79._12_4_ * fVar147;
  auVar24 = vfmadd231ps_fma(auVar159,auVar23,auVar81);
  auVar29 = vfmadd231ps_fma(auVar149,auVar23,auVar20);
  auVar23 = vfmadd231ps_fma(auVar85,auVar22,auVar23);
  auVar24 = vfmadd231ps_fma(auVar24,auVar187,auVar80);
  auVar29 = vfmadd231ps_fma(auVar29,auVar187,auVar19);
  auVar30 = vfmadd231ps_fma(auVar23,auVar21,auVar187);
  auVar210._4_4_ = auVar180._0_4_;
  auVar210._0_4_ = auVar180._0_4_;
  auVar210._8_4_ = auVar180._0_4_;
  auVar210._12_4_ = auVar180._0_4_;
  auVar23 = vshufps_avx(auVar180,auVar180,0x55);
  auVar76 = vshufps_avx512vl(auVar180,auVar180,0xaa);
  auVar77 = vmulps_avx512vl(auVar76,auVar77);
  auVar78 = vmulps_avx512vl(auVar76,auVar78);
  auVar79 = vmulps_avx512vl(auVar76,auVar79);
  auVar81 = vfmadd231ps_fma(auVar77,auVar23,auVar81);
  auVar77 = vfmadd231ps_fma(auVar78,auVar23,auVar20);
  auVar20 = vfmadd231ps_fma(auVar79,auVar23,auVar22);
  auVar216 = vfmadd231ps_fma(auVar81,auVar210,auVar80);
  auVar85 = vfmadd231ps_fma(auVar77,auVar210,auVar19);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar215 = ZEXT1664(auVar80);
  auVar136 = vfmadd231ps_fma(auVar20,auVar210,auVar21);
  auVar81 = vandps_avx512vl(auVar24,auVar80);
  auVar197._8_4_ = 0x219392ef;
  auVar197._0_8_ = 0x219392ef219392ef;
  auVar197._12_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar81,auVar197,1);
  bVar13 = (bool)((byte)uVar71 & 1);
  auVar82._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar24._0_4_;
  bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar24._4_4_;
  bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar24._8_4_;
  bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar24._12_4_;
  auVar81 = vandps_avx512vl(auVar29,auVar80);
  uVar71 = vcmpps_avx512vl(auVar81,auVar197,1);
  bVar13 = (bool)((byte)uVar71 & 1);
  auVar83._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._0_4_;
  bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._4_4_;
  bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._8_4_;
  bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._12_4_;
  auVar80 = vandps_avx512vl(auVar30,auVar80);
  uVar71 = vcmpps_avx512vl(auVar80,auVar197,1);
  bVar13 = (bool)((byte)uVar71 & 1);
  auVar84._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._0_4_;
  bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._4_4_;
  bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._8_4_;
  bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar82);
  auVar198._8_4_ = 0x3f800000;
  auVar198._0_8_ = 0x3f8000003f800000;
  auVar198._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar82,auVar81,auVar198);
  auVar30 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar83);
  auVar80 = vfnmadd213ps_fma(auVar83,auVar81,auVar198);
  auVar76 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar84);
  auVar80 = vfnmadd213ps_fma(auVar84,auVar81,auVar198);
  auVar214 = vfmadd132ps_fma(auVar80,auVar81,auVar81);
  fVar157 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar195._4_4_ = fVar157;
  auVar195._0_4_ = fVar157;
  auVar195._8_4_ = fVar157;
  auVar195._12_4_ = fVar157;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar19 = vsubps_avx(auVar81,auVar80);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar77);
  auVar77 = vfmadd213ps_fma(auVar19,auVar195,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar81);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar81 = vpmovsxwd_avx(auVar19);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar19 = vfmadd213ps_fma(auVar81,auVar195,auVar80);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar80 = vpmovsxwd_avx(auVar20);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar71 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar71 + 6);
  auVar81 = vpmovsxwd_avx(auVar78);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar20 = vfmadd213ps_fma(auVar81,auVar195,auVar80);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar80 = vpmovsxwd_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar22);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar78 = vfmadd213ps_fma(auVar81,auVar195,auVar80);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar80 = vpmovsxwd_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar81 = vpmovsxwd_avx(auVar23);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar21 = vfmadd213ps_fma(auVar81,auVar195,auVar80);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar64) + 6);
  auVar80 = vpmovsxwd_avx(auVar24);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar29);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar81 = vfmadd213ps_fma(auVar81,auVar195,auVar80);
  auVar80 = vsubps_avx(auVar77,auVar216);
  auVar196._0_4_ = auVar30._0_4_ * auVar80._0_4_;
  auVar196._4_4_ = auVar30._4_4_ * auVar80._4_4_;
  auVar196._8_4_ = auVar30._8_4_ * auVar80._8_4_;
  auVar196._12_4_ = auVar30._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar19,auVar216);
  auVar160._0_4_ = auVar30._0_4_ * auVar80._0_4_;
  auVar160._4_4_ = auVar30._4_4_ * auVar80._4_4_;
  auVar160._8_4_ = auVar30._8_4_ * auVar80._8_4_;
  auVar160._12_4_ = auVar30._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar20,auVar85);
  auVar188._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar188._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar188._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar188._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar78,auVar85);
  auVar150._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar150._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar150._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar150._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar21,auVar136);
  auVar181._0_4_ = auVar214._0_4_ * auVar80._0_4_;
  auVar181._4_4_ = auVar214._4_4_ * auVar80._4_4_;
  auVar181._8_4_ = auVar214._8_4_ * auVar80._8_4_;
  auVar181._12_4_ = auVar214._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar81,auVar136);
  auVar136._0_4_ = auVar214._0_4_ * auVar80._0_4_;
  auVar136._4_4_ = auVar214._4_4_ * auVar80._4_4_;
  auVar136._8_4_ = auVar214._8_4_ * auVar80._8_4_;
  auVar136._12_4_ = auVar214._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar196,auVar160);
  auVar81 = vpminsd_avx(auVar188,auVar150);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar81 = vpminsd_avx(auVar181,auVar136);
  uVar135 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar30._4_4_ = uVar135;
  auVar30._0_4_ = uVar135;
  auVar30._8_4_ = uVar135;
  auVar30._12_4_ = uVar135;
  auVar81 = vmaxps_avx512vl(auVar81,auVar30);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar76._8_4_ = 0x3f7ffffa;
  auVar76._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar76._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar80,auVar76);
  auVar80 = vpmaxsd_avx(auVar196,auVar160);
  auVar81 = vpmaxsd_avx(auVar188,auVar150);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar81 = vpmaxsd_avx(auVar181,auVar136);
  fVar157 = (ray->super_RayK<1>).tfar;
  auVar214._4_4_ = fVar157;
  auVar214._0_4_ = fVar157;
  auVar214._8_4_ = fVar157;
  auVar214._12_4_ = fVar157;
  auVar81 = vminps_avx512vl(auVar81,auVar214);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar216._8_4_ = 0x3f800003;
  auVar216._0_8_ = 0x3f8000033f800003;
  auVar216._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar216);
  auVar81 = vpbroadcastd_avx512vl();
  uVar148 = vcmpps_avx512vl(local_190,auVar80,2);
  uVar71 = vpcmpgtd_avx512vl(auVar81,_DAT_01f7fcf0);
  uVar71 = ((byte)uVar148 & 0xf) & uVar71;
  if ((char)uVar71 != '\0') {
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
    auVar217 = ZEXT1664(auVar80);
    local_518 = prim;
    local_520 = pre;
    do {
      auVar97 = local_460;
      lVar28 = 0;
      for (uVar64 = uVar71; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar70 = *(uint *)(prim + 2);
      uVar66 = *(uint *)(prim + lVar28 * 4 + 6);
      local_530 = (ulong)uVar70;
      pGVar68 = (context->scene->geometries).items[uVar70].ptr;
      local_528 = (ulong)uVar66;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar68->field_0x58 +
                               (ulong)uVar66 *
                               pGVar68[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar157 = (pGVar68->time_range).lower;
      fVar157 = pGVar68->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar157) /
                ((pGVar68->time_range).upper - fVar157));
      auVar80 = vroundss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),9);
      auVar81 = vaddss_avx512f(ZEXT416((uint)pGVar68->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar80 = vminss_avx(auVar80,auVar81);
      auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
      fVar157 = fVar157 - auVar80._0_4_;
      fVar145 = 1.0 - fVar157;
      _Var9 = pGVar68[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar67 = (long)(int)auVar80._0_4_ * 0x38;
      lVar69 = *(long *)(_Var9 + 0x10 + lVar67);
      lVar10 = *(long *)(_Var9 + 0x38 + lVar67);
      lVar11 = *(long *)(_Var9 + 0x48 + lVar67);
      auVar137._4_4_ = fVar157;
      auVar137._0_4_ = fVar157;
      auVar137._8_4_ = fVar157;
      auVar137._12_4_ = fVar157;
      pfVar3 = (float *)(lVar10 + lVar11 * uVar64);
      auVar201._0_4_ = fVar157 * *pfVar3;
      auVar201._4_4_ = fVar157 * pfVar3[1];
      auVar201._8_4_ = fVar157 * pfVar3[2];
      auVar201._12_4_ = fVar157 * pfVar3[3];
      lVar28 = uVar64 + 1;
      auVar80 = vmulps_avx512vl(auVar137,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar28));
      p_Var12 = pGVar68[4].occlusionFilterN;
      auVar151._4_4_ = fVar145;
      auVar151._0_4_ = fVar145;
      auVar151._8_4_ = fVar145;
      auVar151._12_4_ = fVar145;
      local_4b0 = vfmadd231ps_fma(auVar201,auVar151,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var9 + lVar67) + lVar69 * uVar64));
      _local_4c0 = vfmadd231ps_avx512vl
                             (auVar80,auVar151,
                              *(undefined1 (*) [16])(*(long *)(_Var9 + lVar67) + lVar69 * lVar28));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar67 + 0x38) +
                        uVar64 * *(long *)(p_Var12 + lVar67 + 0x48));
      auVar203._0_4_ = fVar157 * *pfVar3;
      auVar203._4_4_ = fVar157 * pfVar3[1];
      auVar203._8_4_ = fVar157 * pfVar3[2];
      auVar203._12_4_ = fVar157 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar67 + 0x38) +
                        *(long *)(p_Var12 + lVar67 + 0x48) * lVar28);
      auVar207._0_4_ = fVar157 * *pfVar3;
      auVar207._4_4_ = fVar157 * pfVar3[1];
      auVar207._8_4_ = fVar157 * pfVar3[2];
      auVar207._12_4_ = fVar157 * pfVar3[3];
      auVar80 = vfmadd231ps_fma(auVar203,auVar151,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar67) +
                                 *(long *)(p_Var12 + lVar67 + 0x10) * uVar64));
      auVar81 = vfmadd231ps_fma(auVar207,auVar151,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar67) +
                                 *(long *)(p_Var12 + lVar67 + 0x10) * lVar28));
      iVar8 = (int)pGVar68[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar28 = (long)iVar8 * 0x44;
      auVar216 = auVar217._0_16_;
      local_4d0 = vfnmadd213ps_avx512vl(auVar80,auVar216,local_4b0);
      local_4e0 = vfmadd213ps_avx512vl(auVar81,auVar216,_local_4c0);
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar81 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
      uVar135 = auVar81._0_4_;
      auVar152._4_4_ = uVar135;
      auVar152._0_4_ = uVar135;
      auVar152._8_4_ = uVar135;
      auVar152._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      aVar5 = (pre->ray_space).vx.field_0;
      aVar6 = (pre->ray_space).vy.field_0;
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      fVar157 = (pre->ray_space).vz.field_0.m128[0];
      fVar145 = (pre->ray_space).vz.field_0.m128[1];
      fVar146 = (pre->ray_space).vz.field_0.m128[2];
      fVar147 = (pre->ray_space).vz.field_0.m128[3];
      auVar206._0_4_ = auVar81._0_4_ * fVar157;
      auVar206._4_4_ = auVar81._4_4_ * fVar145;
      auVar206._8_4_ = auVar81._8_4_ * fVar146;
      auVar206._12_4_ = auVar81._12_4_ * fVar147;
      auVar80 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar80);
      auVar77 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar152);
      auVar81 = vsubps_avx(local_4d0,(undefined1  [16])aVar4);
      uVar135 = auVar81._0_4_;
      auVar153._4_4_ = uVar135;
      auVar153._0_4_ = uVar135;
      auVar153._8_4_ = uVar135;
      auVar153._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar208._0_4_ = auVar81._0_4_ * fVar157;
      auVar208._4_4_ = auVar81._4_4_ * fVar145;
      auVar208._8_4_ = auVar81._8_4_ * fVar146;
      auVar208._12_4_ = auVar81._12_4_ * fVar147;
      auVar80 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar80);
      auVar19 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar153);
      auVar81 = vsubps_avx(local_4e0,(undefined1  [16])aVar4);
      uVar135 = auVar81._0_4_;
      auVar154._4_4_ = uVar135;
      auVar154._0_4_ = uVar135;
      auVar154._8_4_ = uVar135;
      auVar154._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar209._0_4_ = fVar157 * auVar81._0_4_;
      auVar209._4_4_ = fVar145 * auVar81._4_4_;
      auVar209._8_4_ = fVar146 * auVar81._8_4_;
      auVar209._12_4_ = fVar147 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar80);
      auVar20 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar154);
      local_3e0 = ZEXT1632((undefined1  [16])aVar4);
      auVar81 = vsubps_avx512vl(_local_4c0,(undefined1  [16])aVar4);
      uVar135 = auVar81._0_4_;
      auVar155._4_4_ = uVar135;
      auVar155._0_4_ = uVar135;
      auVar155._8_4_ = uVar135;
      auVar155._12_4_ = uVar135;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar211._0_4_ = auVar81._0_4_ * fVar157;
      auVar211._4_4_ = auVar81._4_4_ * fVar145;
      auVar211._8_4_ = auVar81._8_4_ * fVar146;
      auVar211._12_4_ = auVar81._12_4_ * fVar147;
      auVar80 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar80);
      auVar78 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar155);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      uVar135 = auVar77._0_4_;
      local_2e0._4_4_ = uVar135;
      local_2e0._0_4_ = uVar135;
      local_2e0._8_4_ = uVar135;
      local_2e0._12_4_ = uVar135;
      local_2e0._16_4_ = uVar135;
      local_2e0._20_4_ = uVar135;
      local_2e0._24_4_ = uVar135;
      local_2e0._28_4_ = uVar135;
      auVar86._8_4_ = 1;
      auVar86._0_8_ = 0x100000001;
      auVar86._12_4_ = 1;
      auVar86._16_4_ = 1;
      auVar86._20_4_ = 1;
      auVar86._24_4_ = 1;
      auVar86._28_4_ = 1;
      local_300 = vpermps_avx2(auVar86,ZEXT1632(auVar77));
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      uVar135 = auVar19._0_4_;
      auVar172._4_4_ = uVar135;
      auVar172._0_4_ = uVar135;
      auVar172._8_4_ = uVar135;
      auVar172._12_4_ = uVar135;
      local_320._16_4_ = uVar135;
      local_320._0_16_ = auVar172;
      local_320._20_4_ = uVar135;
      local_320._24_4_ = uVar135;
      local_320._28_4_ = uVar135;
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      local_340 = vpermps_avx512vl(auVar86,ZEXT1632(auVar19));
      local_360 = vbroadcastss_avx512vl(auVar20);
      local_380 = vpermps_avx512vl(auVar86,ZEXT1632(auVar20));
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      uVar135 = auVar78._0_4_;
      local_3a0._4_4_ = uVar135;
      local_3a0._0_4_ = uVar135;
      fStack_398 = (float)uVar135;
      fStack_394 = (float)uVar135;
      fStack_390 = (float)uVar135;
      fStack_38c = (float)uVar135;
      fStack_388 = (float)uVar135;
      register0x0000139c = uVar135;
      _local_3c0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar78));
      auVar86 = vmulps_avx512vl(_local_3a0,auVar100);
      auVar87 = vmulps_avx512vl(_local_3c0,auVar100);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar101,local_360);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_380);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar102,local_320);
      auVar88 = vfmadd231ps_avx512vl(auVar87,auVar102,local_340);
      auVar89 = vfmadd231ps_avx512vl(auVar86,auVar99,local_2e0);
      auVar193 = ZEXT3264(auVar89);
      auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar99,local_300);
      auVar186 = ZEXT3264(auVar90);
      auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar91 = vmulps_avx512vl(_local_3a0,auVar98);
      auVar92 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_360);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_380);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_320);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_340);
      auVar21 = vfmadd231ps_fma(auVar91,auVar86,local_2e0);
      auVar199 = ZEXT1664(auVar21);
      auVar22 = vfmadd231ps_fma(auVar92,auVar86,local_300);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar21),auVar89);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar22),auVar90);
      auVar93 = vmulps_avx512vl(auVar90,auVar91);
      auVar94 = vmulps_avx512vl(auVar89,auVar92);
      auVar93 = vsubps_avx512vl(auVar93,auVar94);
      auVar80 = vshufps_avx(local_4b0,local_4b0,0xff);
      uVar148 = auVar80._0_8_;
      local_80._8_8_ = uVar148;
      local_80._0_8_ = uVar148;
      local_80._16_8_ = uVar148;
      local_80._24_8_ = uVar148;
      auVar80 = vshufps_avx(local_4d0,local_4d0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx(local_4e0,local_4e0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx512vl(_local_4c0,_local_4c0,0xff);
      uVar148 = auVar80._0_8_;
      local_e0._8_8_ = uVar148;
      local_e0._0_8_ = uVar148;
      local_e0._16_8_ = uVar148;
      local_e0._24_8_ = uVar148;
      auVar94 = vmulps_avx512vl(local_e0,auVar100);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_a0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_80);
      auVar95 = vmulps_avx512vl(local_e0,auVar98);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar87,local_a0);
      auVar79 = vfmadd231ps_fma(auVar95,auVar86,local_80);
      auVar95 = vmulps_avx512vl(auVar92,auVar92);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar91);
      auVar96 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar79));
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      auVar95 = vmulps_avx512vl(auVar96,auVar95);
      auVar93 = vmulps_avx512vl(auVar93,auVar93);
      uVar148 = vcmpps_avx512vl(auVar93,auVar95,2);
      auVar30 = local_4b0;
      auVar80 = vblendps_avx(auVar77,local_4b0,8);
      auVar214 = auVar215._0_16_;
      auVar81 = vandps_avx512vl(auVar80,auVar214);
      auVar24 = local_4d0;
      auVar80 = vblendps_avx(auVar19,local_4d0,8);
      auVar80 = vandps_avx512vl(auVar80,auVar214);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      auVar23 = local_4e0;
      auVar80 = vblendps_avx(auVar20,local_4e0,8);
      auVar76 = vandps_avx512vl(auVar80,auVar214);
      auVar29 = _local_4c0;
      auVar80 = vblendps_avx(auVar78,_local_4c0,8);
      auVar80 = vandps_avx512vl(auVar80,auVar214);
      auVar80 = vmaxps_avx(auVar76,auVar80);
      auVar80 = vmaxps_avx(auVar81,auVar80);
      auVar81 = vmovshdup_avx(auVar80);
      auVar81 = vmaxss_avx(auVar81,auVar80);
      auVar80 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxss_avx(auVar80,auVar81);
      auVar93._0_4_ = (float)iVar8;
      local_460._4_12_ = local_4e0._4_12_;
      local_460._0_4_ = auVar93._0_4_;
      local_460._16_16_ = auVar97._16_16_;
      auVar93._4_4_ = auVar93._0_4_;
      auVar93._8_4_ = auVar93._0_4_;
      auVar93._12_4_ = auVar93._0_4_;
      auVar93._16_4_ = auVar93._0_4_;
      auVar93._20_4_ = auVar93._0_4_;
      auVar93._24_4_ = auVar93._0_4_;
      auVar93._28_4_ = auVar93._0_4_;
      uVar25 = vcmpps_avx512vl(auVar93,_DAT_01faff40,0xe);
      bVar72 = (byte)uVar148 & (byte)uVar25;
      fVar157 = auVar80._0_4_ * 4.7683716e-07;
      local_440._0_16_ = ZEXT416((uint)fVar157);
      auVar97._8_4_ = 2;
      auVar97._0_8_ = 0x200000002;
      auVar97._12_4_ = 2;
      auVar97._16_4_ = 2;
      auVar97._20_4_ = 2;
      auVar97._24_4_ = 2;
      auVar97._28_4_ = 2;
      local_120 = vpermps_avx2(auVar97,ZEXT1632(auVar77));
      local_140 = vpermps_avx2(auVar97,ZEXT1632(auVar19));
      local_160 = vpermps_avx2(auVar97,ZEXT1632(auVar20));
      local_180 = vpermps_avx2(auVar97,ZEXT1632(auVar78));
      local_4e0 = auVar23;
      local_4d0 = auVar24;
      _local_4c0 = auVar29;
      local_4b0 = auVar30;
      if (bVar72 != 0) {
        auVar97 = vmulps_avx512vl(local_180,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar88,local_160,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar87,local_140,auVar97);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar97);
        auVar97 = vmulps_avx512vl(local_180,auVar100);
        auVar97 = vfmadd213ps_avx512vl(auVar101,local_160,auVar97);
        auVar87 = vfmadd213ps_avx512vl(auVar102,local_140,auVar97);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar99,local_120,auVar87);
        auVar99 = vmulps_avx512vl(_local_3a0,auVar100);
        auVar87 = vmulps_avx512vl(_local_3c0,auVar100);
        auVar100 = vmulps_avx512vl(local_180,auVar100);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_360);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar100,local_160,auVar101);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar87,auVar102,local_340);
        auVar87 = vfmadd231ps_avx512vl(auVar101,local_140,auVar102);
        auVar80 = vfmadd231ps_fma(auVar99,auVar97,local_2e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_300);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar87 = vfmadd231ps_avx512vl(auVar87,local_120,auVar97);
        auVar97 = vmulps_avx512vl(_local_3a0,auVar101);
        auVar88 = vmulps_avx512vl(_local_3c0,auVar101);
        auVar101 = vmulps_avx512vl(local_180,auVar101);
        auVar95 = vfmadd231ps_avx512vl(auVar97,auVar102,local_360);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar101,local_160,auVar102);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar101 = vfmadd231ps_avx512vl(auVar95,auVar97,local_320);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar102,local_140,auVar97);
        auVar217 = ZEXT1664(auVar216);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar215 = ZEXT1664(auVar81);
        auVar81 = vfmadd231ps_fma(auVar101,auVar99,local_2e0);
        auVar102 = vfmadd231ps_avx512vl(auVar88,auVar99,local_300);
        auVar101 = vfmadd231ps_avx512vl(auVar97,local_120,auVar99);
        auVar212._8_4_ = 0x7fffffff;
        auVar212._0_8_ = 0x7fffffff7fffffff;
        auVar212._12_4_ = 0x7fffffff;
        auVar212._16_4_ = 0x7fffffff;
        auVar212._20_4_ = 0x7fffffff;
        auVar212._24_4_ = 0x7fffffff;
        auVar212._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(ZEXT1632(auVar80),auVar212);
        auVar99 = vandps_avx(auVar100,auVar212);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar87,auVar212);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        auVar204._4_4_ = fVar157;
        auVar204._0_4_ = fVar157;
        auVar204._8_4_ = fVar157;
        auVar204._12_4_ = fVar157;
        auVar204._16_4_ = fVar157;
        auVar204._20_4_ = fVar157;
        auVar204._24_4_ = fVar157;
        auVar204._28_4_ = fVar157;
        uVar64 = vcmpps_avx512vl(auVar97,auVar204,1);
        bVar13 = (bool)((byte)uVar64 & 1);
        auVar95._0_4_ = (float)((uint)bVar13 * auVar91._0_4_ | (uint)!bVar13 * auVar80._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar80._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar80._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar80._12_4_);
        fVar145 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar95._16_4_ = fVar145;
        fVar157 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar95._20_4_ = fVar157;
        fVar146 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar95._24_4_ = fVar146;
        auVar95._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        bVar13 = (bool)((byte)uVar64 & 1);
        auVar96._0_4_ = (float)((uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar100._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar100._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar100._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar100._12_4_);
        bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar13 * auVar92._16_4_ | (uint)!bVar13 * auVar100._16_4_);
        bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar13 * auVar92._20_4_ | (uint)!bVar13 * auVar100._20_4_);
        bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar13 * auVar92._24_4_ | (uint)!bVar13 * auVar100._24_4_);
        bVar13 = SUB81(uVar64 >> 7,0);
        auVar96._28_4_ = (uint)bVar13 * auVar92._28_4_ | (uint)!bVar13 * auVar100._28_4_;
        auVar97 = vandps_avx(auVar212,ZEXT1632(auVar81));
        auVar99 = vandps_avx(auVar102,auVar212);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar101,auVar212);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        uVar64 = vcmpps_avx512vl(auVar97,auVar204,1);
        bVar13 = (bool)((byte)uVar64 & 1);
        auVar103._0_4_ = (float)((uint)bVar13 * auVar91._0_4_ | (uint)!bVar13 * auVar81._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar81._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar81._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar81._12_4_);
        fVar147 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar103._16_4_ = fVar147;
        fVar202 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar103._20_4_ = fVar202;
        fVar171 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar103._24_4_ = fVar171;
        uVar65 = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        auVar103._28_4_ = uVar65;
        bVar13 = (bool)((byte)uVar64 & 1);
        auVar104._0_4_ = (float)((uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar13 * auVar92._16_4_ | (uint)!bVar13 * auVar102._16_4_);
        bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar13 * auVar92._20_4_ | (uint)!bVar13 * auVar102._20_4_);
        bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar13 * auVar92._24_4_ | (uint)!bVar13 * auVar102._24_4_);
        bVar13 = SUB81(uVar64 >> 7,0);
        auVar104._28_4_ = (uint)bVar13 * auVar92._28_4_ | (uint)!bVar13 * auVar102._28_4_;
        auVar85 = vxorps_avx512vl(auVar172,auVar172);
        auVar97 = vfmadd213ps_avx512vl(auVar95,auVar95,ZEXT1632(auVar85));
        auVar80 = vfmadd231ps_fma(auVar97,auVar96,auVar96);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar74 = auVar97._0_4_;
        fVar75 = auVar97._4_4_;
        fVar126 = auVar97._8_4_;
        fVar127 = auVar97._12_4_;
        fVar128 = auVar97._16_4_;
        fVar129 = auVar97._20_4_;
        fVar131 = auVar97._24_4_;
        auVar99._4_4_ = fVar75 * fVar75 * fVar75 * auVar80._4_4_ * -0.5;
        auVar99._0_4_ = fVar74 * fVar74 * fVar74 * auVar80._0_4_ * -0.5;
        auVar99._8_4_ = fVar126 * fVar126 * fVar126 * auVar80._8_4_ * -0.5;
        auVar99._12_4_ = fVar127 * fVar127 * fVar127 * auVar80._12_4_ * -0.5;
        auVar99._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar99._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar99._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar99._28_4_ = auVar101._28_4_;
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar97 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar97);
        auVar102._4_4_ = auVar96._4_4_ * auVar97._4_4_;
        auVar102._0_4_ = auVar96._0_4_ * auVar97._0_4_;
        auVar102._8_4_ = auVar96._8_4_ * auVar97._8_4_;
        auVar102._12_4_ = auVar96._12_4_ * auVar97._12_4_;
        auVar102._16_4_ = auVar96._16_4_ * auVar97._16_4_;
        auVar102._20_4_ = auVar96._20_4_ * auVar97._20_4_;
        auVar102._24_4_ = auVar96._24_4_ * auVar97._24_4_;
        auVar102._28_4_ = 0;
        auVar101._4_4_ = auVar97._4_4_ * -auVar95._4_4_;
        auVar101._0_4_ = auVar97._0_4_ * -auVar95._0_4_;
        auVar101._8_4_ = auVar97._8_4_ * -auVar95._8_4_;
        auVar101._12_4_ = auVar97._12_4_ * -auVar95._12_4_;
        auVar101._16_4_ = auVar97._16_4_ * -fVar145;
        auVar101._20_4_ = auVar97._20_4_ * -fVar157;
        auVar101._24_4_ = auVar97._24_4_ * -fVar146;
        auVar101._28_4_ = auVar96._28_4_;
        auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar85));
        auVar92 = ZEXT1632(auVar85);
        auVar99 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar92);
        auVar80 = vfmadd231ps_fma(auVar99,auVar104,auVar104);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar157 = auVar99._0_4_;
        fVar145 = auVar99._4_4_;
        fVar146 = auVar99._8_4_;
        fVar74 = auVar99._12_4_;
        fVar75 = auVar99._16_4_;
        fVar126 = auVar99._20_4_;
        fVar127 = auVar99._24_4_;
        auVar100._4_4_ = fVar145 * fVar145 * fVar145 * auVar80._4_4_ * -0.5;
        auVar100._0_4_ = fVar157 * fVar157 * fVar157 * auVar80._0_4_ * -0.5;
        auVar100._8_4_ = fVar146 * fVar146 * fVar146 * auVar80._8_4_ * -0.5;
        auVar100._12_4_ = fVar74 * fVar74 * fVar74 * auVar80._12_4_ * -0.5;
        auVar100._16_4_ = fVar75 * fVar75 * fVar75 * -0.0;
        auVar100._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar100._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar100._28_4_ = 0;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar99);
        auVar87._4_4_ = auVar104._4_4_ * auVar100._4_4_;
        auVar87._0_4_ = auVar104._0_4_ * auVar100._0_4_;
        auVar87._8_4_ = auVar104._8_4_ * auVar100._8_4_;
        auVar87._12_4_ = auVar104._12_4_ * auVar100._12_4_;
        auVar87._16_4_ = auVar104._16_4_ * auVar100._16_4_;
        auVar87._20_4_ = auVar104._20_4_ * auVar100._20_4_;
        auVar87._24_4_ = auVar104._24_4_ * auVar100._24_4_;
        auVar87._28_4_ = auVar99._28_4_;
        auVar88._4_4_ = -auVar103._4_4_ * auVar100._4_4_;
        auVar88._0_4_ = -auVar103._0_4_ * auVar100._0_4_;
        auVar88._8_4_ = -auVar103._8_4_ * auVar100._8_4_;
        auVar88._12_4_ = -auVar103._12_4_ * auVar100._12_4_;
        auVar88._16_4_ = -fVar147 * auVar100._16_4_;
        auVar88._20_4_ = -fVar202 * auVar100._20_4_;
        auVar88._24_4_ = -fVar171 * auVar100._24_4_;
        auVar88._28_4_ = uVar65 ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar100,auVar92);
        auVar80 = vfmadd213ps_fma(auVar102,auVar94,auVar89);
        auVar81 = vfmadd213ps_fma(auVar101,auVar94,auVar90);
        auVar100 = vfmadd213ps_avx512vl(auVar97,auVar94,auVar98);
        auVar91 = vfmadd213ps_avx512vl(auVar87,ZEXT1632(auVar79),ZEXT1632(auVar21));
        auVar76 = vfnmadd213ps_fma(auVar102,auVar94,auVar89);
        auVar89 = ZEXT1632(auVar79);
        auVar77 = vfmadd213ps_fma(auVar88,auVar89,ZEXT1632(auVar22));
        auVar214 = vfnmadd213ps_fma(auVar101,auVar94,auVar90);
        auVar19 = vfmadd213ps_fma(auVar99,auVar89,auVar86);
        auVar102 = vfnmadd231ps_avx512vl(auVar98,auVar94,auVar97);
        auVar21 = vfnmadd213ps_fma(auVar87,auVar89,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar88,auVar89,ZEXT1632(auVar22));
        auVar216 = vfnmadd231ps_fma(auVar86,ZEXT1632(auVar79),auVar99);
        auVar99 = vsubps_avx512vl(auVar91,ZEXT1632(auVar76));
        auVar97 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar214));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar19),auVar102);
        auVar86 = vmulps_avx512vl(auVar97,auVar102);
        auVar20 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar214),auVar101);
        auVar98._4_4_ = auVar76._4_4_ * auVar101._4_4_;
        auVar98._0_4_ = auVar76._0_4_ * auVar101._0_4_;
        auVar98._8_4_ = auVar76._8_4_ * auVar101._8_4_;
        auVar98._12_4_ = auVar76._12_4_ * auVar101._12_4_;
        auVar98._16_4_ = auVar101._16_4_ * 0.0;
        auVar98._20_4_ = auVar101._20_4_ * 0.0;
        auVar98._24_4_ = auVar101._24_4_ * 0.0;
        auVar98._28_4_ = auVar101._28_4_;
        auVar101 = vfmsub231ps_avx512vl(auVar98,auVar102,auVar99);
        auVar89._4_4_ = auVar214._4_4_ * auVar99._4_4_;
        auVar89._0_4_ = auVar214._0_4_ * auVar99._0_4_;
        auVar89._8_4_ = auVar214._8_4_ * auVar99._8_4_;
        auVar89._12_4_ = auVar214._12_4_ * auVar99._12_4_;
        auVar89._16_4_ = auVar99._16_4_ * 0.0;
        auVar89._20_4_ = auVar99._20_4_ * 0.0;
        auVar89._24_4_ = auVar99._24_4_ * 0.0;
        auVar89._28_4_ = auVar99._28_4_;
        auVar78 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar76),auVar97);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar92,auVar101);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,ZEXT1632(auVar20));
        auVar95 = ZEXT1632(auVar85);
        uVar64 = vcmpps_avx512vl(auVar97,auVar95,2);
        bVar63 = (byte)uVar64;
        fVar74 = (float)((uint)(bVar63 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar21._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar126 = (float)((uint)bVar13 * auVar80._4_4_ | (uint)!bVar13 * auVar21._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar128 = (float)((uint)bVar13 * auVar80._8_4_ | (uint)!bVar13 * auVar21._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar131 = (float)((uint)bVar13 * auVar80._12_4_ | (uint)!bVar13 * auVar21._12_4_);
        auVar87 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar128,CONCAT44(fVar126,fVar74))));
        fVar75 = (float)((uint)(bVar63 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar22._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar127 = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar22._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar129 = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar22._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar132 = (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar22._12_4_);
        auVar88 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar129,CONCAT44(fVar127,fVar75))));
        auVar105._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar100._0_4_ |
                    (uint)!(bool)(bVar63 & 1) * auVar216._0_4_);
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar216._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar216._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar216._12_4_);
        fVar157 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_);
        auVar105._16_4_ = fVar157;
        fVar145 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_);
        auVar105._20_4_ = fVar145;
        fVar146 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_);
        auVar105._24_4_ = fVar146;
        iVar1 = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar105._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar91);
        auVar106._0_4_ =
             (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar20._0_4_;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar20._4_4_;
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar20._8_4_;
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar20._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_;
        auVar106._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar214),ZEXT1632(auVar77));
        auVar107._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar81._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar81._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar81._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar81._12_4_);
        fVar202 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
        auVar107._16_4_ = fVar202;
        fVar171 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
        auVar107._20_4_ = fVar171;
        fVar147 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
        auVar107._24_4_ = fVar147;
        auVar107._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar19));
        auVar108._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar100._0_4_
                    );
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar100._4_4_);
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar100._8_4_);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar100._12_4_);
        bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar100._16_4_);
        bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar100._20_4_);
        bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar100._24_4_);
        bVar13 = SUB81(uVar64 >> 7,0);
        auVar108._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar100._28_4_;
        auVar109._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar91._0_4_;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar13 * (int)auVar76._4_4_ | (uint)!bVar13 * auVar91._4_4_;
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar13 * (int)auVar76._8_4_ | (uint)!bVar13 * auVar91._8_4_;
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar13 * (int)auVar76._12_4_ | (uint)!bVar13 * auVar91._12_4_;
        auVar109._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_;
        auVar109._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_;
        auVar109._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_;
        auVar109._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar91._28_4_;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar110._0_4_ =
             (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar19._0_4_;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar19._4_4_;
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar19._8_4_;
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar19._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar64 >> 7) * auVar102._28_4_;
        auVar110._28_4_ = iVar2;
        auVar98 = vsubps_avx512vl(auVar109,auVar87);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar214._12_4_ |
                                                (uint)!bVar16 * auVar77._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar214._8_4_ |
                                                         (uint)!bVar15 * auVar77._8_4_,
                                                         CONCAT44((uint)bVar13 * (int)auVar214._4_4_
                                                                  | (uint)!bVar13 * auVar77._4_4_,
                                                                  (uint)(bVar63 & 1) *
                                                                  (int)auVar214._0_4_ |
                                                                  (uint)!(bool)(bVar63 & 1) *
                                                                  auVar77._0_4_)))),auVar88);
        auVar193 = ZEXT3264(auVar99);
        auVar102 = vsubps_avx(auVar110,auVar105);
        auVar101 = vsubps_avx(auVar87,auVar106);
        auVar199 = ZEXT3264(auVar101);
        auVar100 = vsubps_avx(auVar88,auVar107);
        auVar86 = vsubps_avx(auVar105,auVar108);
        auVar90._4_4_ = auVar102._4_4_ * fVar126;
        auVar90._0_4_ = auVar102._0_4_ * fVar74;
        auVar90._8_4_ = auVar102._8_4_ * fVar128;
        auVar90._12_4_ = auVar102._12_4_ * fVar131;
        auVar90._16_4_ = auVar102._16_4_ * 0.0;
        auVar90._20_4_ = auVar102._20_4_ * 0.0;
        auVar90._24_4_ = auVar102._24_4_ * 0.0;
        auVar90._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar90,auVar105,auVar98);
        auVar91._4_4_ = fVar127 * auVar98._4_4_;
        auVar91._0_4_ = fVar75 * auVar98._0_4_;
        auVar91._8_4_ = fVar129 * auVar98._8_4_;
        auVar91._12_4_ = fVar132 * auVar98._12_4_;
        auVar91._16_4_ = auVar98._16_4_ * 0.0;
        auVar91._20_4_ = auVar98._20_4_ * 0.0;
        auVar91._24_4_ = auVar98._24_4_ * 0.0;
        auVar91._28_4_ = auVar97._28_4_;
        auVar81 = vfmsub231ps_fma(auVar91,auVar87,auVar99);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar95,ZEXT1632(auVar80));
        auVar182._0_4_ = auVar99._0_4_ * auVar105._0_4_;
        auVar182._4_4_ = auVar99._4_4_ * auVar105._4_4_;
        auVar182._8_4_ = auVar99._8_4_ * auVar105._8_4_;
        auVar182._12_4_ = auVar99._12_4_ * auVar105._12_4_;
        auVar182._16_4_ = auVar99._16_4_ * fVar157;
        auVar182._20_4_ = auVar99._20_4_ * fVar145;
        auVar182._24_4_ = auVar99._24_4_ * fVar146;
        auVar182._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar182,auVar88,auVar102);
        auVar89 = vfmadd231ps_avx512vl(auVar97,auVar95,ZEXT1632(auVar80));
        auVar97 = vmulps_avx512vl(auVar86,auVar106);
        auVar97 = vfmsub231ps_avx512vl(auVar97,auVar101,auVar108);
        auVar92._4_4_ = auVar100._4_4_ * auVar108._4_4_;
        auVar92._0_4_ = auVar100._0_4_ * auVar108._0_4_;
        auVar92._8_4_ = auVar100._8_4_ * auVar108._8_4_;
        auVar92._12_4_ = auVar100._12_4_ * auVar108._12_4_;
        auVar92._16_4_ = auVar100._16_4_ * auVar108._16_4_;
        auVar92._20_4_ = auVar100._20_4_ * auVar108._20_4_;
        auVar92._24_4_ = auVar100._24_4_ * auVar108._24_4_;
        auVar92._28_4_ = auVar108._28_4_;
        auVar80 = vfmsub231ps_fma(auVar92,auVar107,auVar86);
        auVar183._0_4_ = auVar107._0_4_ * auVar101._0_4_;
        auVar183._4_4_ = auVar107._4_4_ * auVar101._4_4_;
        auVar183._8_4_ = auVar107._8_4_ * auVar101._8_4_;
        auVar183._12_4_ = auVar107._12_4_ * auVar101._12_4_;
        auVar183._16_4_ = fVar202 * auVar101._16_4_;
        auVar183._20_4_ = fVar171 * auVar101._20_4_;
        auVar183._24_4_ = fVar147 * auVar101._24_4_;
        auVar183._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar183,auVar100,auVar106);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar95,auVar97);
        auVar90 = vfmadd231ps_avx512vl(auVar97,auVar95,ZEXT1632(auVar80));
        auVar186 = ZEXT3264(auVar90);
        auVar97 = vmaxps_avx(auVar89,auVar90);
        uVar148 = vcmpps_avx512vl(auVar97,auVar95,2);
        bVar72 = bVar72 & (byte)uVar148;
        if (bVar72 != 0) {
          auVar41._4_4_ = auVar86._4_4_ * auVar99._4_4_;
          auVar41._0_4_ = auVar86._0_4_ * auVar99._0_4_;
          auVar41._8_4_ = auVar86._8_4_ * auVar99._8_4_;
          auVar41._12_4_ = auVar86._12_4_ * auVar99._12_4_;
          auVar41._16_4_ = auVar86._16_4_ * auVar99._16_4_;
          auVar41._20_4_ = auVar86._20_4_ * auVar99._20_4_;
          auVar41._24_4_ = auVar86._24_4_ * auVar99._24_4_;
          auVar41._28_4_ = auVar97._28_4_;
          auVar19 = vfmsub231ps_fma(auVar41,auVar100,auVar102);
          auVar42._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar42._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar42._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar42._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar42._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar42._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar42._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar42._28_4_ = auVar102._28_4_;
          auVar77 = vfmsub231ps_fma(auVar42,auVar98,auVar86);
          auVar43._4_4_ = auVar100._4_4_ * auVar98._4_4_;
          auVar43._0_4_ = auVar100._0_4_ * auVar98._0_4_;
          auVar43._8_4_ = auVar100._8_4_ * auVar98._8_4_;
          auVar43._12_4_ = auVar100._12_4_ * auVar98._12_4_;
          auVar43._16_4_ = auVar100._16_4_ * auVar98._16_4_;
          auVar43._20_4_ = auVar100._20_4_ * auVar98._20_4_;
          auVar43._24_4_ = auVar100._24_4_ * auVar98._24_4_;
          auVar43._28_4_ = auVar100._28_4_;
          auVar20 = vfmsub231ps_fma(auVar43,auVar101,auVar99);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar20));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar19),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar99 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar81),auVar32);
          auVar80 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
          auVar193 = ZEXT1664(auVar80);
          auVar44._4_4_ = auVar20._4_4_ * auVar105._4_4_;
          auVar44._0_4_ = auVar20._0_4_ * auVar105._0_4_;
          auVar44._8_4_ = auVar20._8_4_ * auVar105._8_4_;
          auVar44._12_4_ = auVar20._12_4_ * auVar105._12_4_;
          auVar44._16_4_ = fVar157 * 0.0;
          auVar44._20_4_ = fVar145 * 0.0;
          auVar44._24_4_ = fVar146 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar77 = vfmadd231ps_fma(auVar44,auVar88,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar87,ZEXT1632(auVar19));
          fVar145 = auVar80._0_4_;
          fVar146 = auVar80._4_4_;
          fVar147 = auVar80._8_4_;
          fVar202 = auVar80._12_4_;
          local_280._28_4_ = auVar97._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar77._12_4_ * fVar202,
                                  CONCAT48(auVar77._8_4_ * fVar147,
                                           CONCAT44(auVar77._4_4_ * fVar146,auVar77._0_4_ * fVar145)
                                          )));
          auVar199 = ZEXT3264(local_280);
          auVar138._8_4_ = 3;
          auVar138._0_8_ = 0x300000003;
          auVar138._12_4_ = 3;
          auVar138._16_4_ = 3;
          auVar138._20_4_ = 3;
          auVar138._24_4_ = 3;
          auVar138._28_4_ = 3;
          auVar97 = vpermps_avx2(auVar138,ZEXT1632((undefined1  [16])aVar4));
          uVar148 = vcmpps_avx512vl(auVar97,local_280,2);
          fVar157 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar157;
          auVar33._0_4_ = fVar157;
          auVar33._8_4_ = fVar157;
          auVar33._12_4_ = fVar157;
          auVar33._16_4_ = fVar157;
          auVar33._20_4_ = fVar157;
          auVar33._24_4_ = fVar157;
          auVar33._28_4_ = fVar157;
          uVar25 = vcmpps_avx512vl(local_280,auVar33,2);
          bVar72 = (byte)uVar148 & (byte)uVar25 & bVar72;
          if (bVar72 != 0) {
            uVar73 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar73 = bVar72 & uVar73;
            if ((char)uVar73 != '\0') {
              fVar157 = auVar89._0_4_ * fVar145;
              fVar171 = auVar89._4_4_ * fVar146;
              auVar45._4_4_ = fVar171;
              auVar45._0_4_ = fVar157;
              fVar74 = auVar89._8_4_ * fVar147;
              auVar45._8_4_ = fVar74;
              fVar75 = auVar89._12_4_ * fVar202;
              auVar45._12_4_ = fVar75;
              fVar126 = auVar89._16_4_ * 0.0;
              auVar45._16_4_ = fVar126;
              fVar127 = auVar89._20_4_ * 0.0;
              auVar45._20_4_ = fVar127;
              fVar128 = auVar89._24_4_ * 0.0;
              auVar45._24_4_ = fVar128;
              auVar45._28_4_ = auVar89._28_4_;
              auVar139._8_4_ = 0x3f800000;
              auVar139._0_8_ = 0x3f8000003f800000;
              auVar139._12_4_ = 0x3f800000;
              auVar139._16_4_ = 0x3f800000;
              auVar139._20_4_ = 0x3f800000;
              auVar139._24_4_ = 0x3f800000;
              auVar139._28_4_ = 0x3f800000;
              auVar97 = vsubps_avx(auVar139,auVar45);
              local_2c0._0_4_ =
                   (float)((uint)(bVar63 & 1) * (int)fVar157 |
                          (uint)!(bool)(bVar63 & 1) * auVar97._0_4_);
              bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar13 * (int)fVar171 | (uint)!bVar13 * auVar97._4_4_)
              ;
              bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar13 * (int)fVar74 | (uint)!bVar13 * auVar97._8_4_);
              bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar13 * (int)fVar75 | (uint)!bVar13 * auVar97._12_4_);
              bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar13 * (int)fVar126 | (uint)!bVar13 * auVar97._16_4_);
              bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar13 * (int)fVar127 | (uint)!bVar13 * auVar97._20_4_);
              bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar13 * (int)fVar128 | (uint)!bVar13 * auVar97._24_4_);
              bVar13 = SUB81(uVar64 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar97._28_4_);
              auVar97 = vsubps_avx(ZEXT1632(auVar79),auVar94);
              auVar80 = vfmadd213ps_fma(auVar97,local_2c0,auVar94);
              fVar157 = pre->depth_scale;
              auVar94._4_4_ = fVar157;
              auVar94._0_4_ = fVar157;
              auVar94._8_4_ = fVar157;
              auVar94._12_4_ = fVar157;
              auVar94._16_4_ = fVar157;
              auVar94._20_4_ = fVar157;
              auVar94._24_4_ = fVar157;
              auVar94._28_4_ = fVar157;
              auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                           CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                    CONCAT44(auVar80._4_4_ +
                                                                             auVar80._4_4_,
                                                                             auVar80._0_4_ +
                                                                             auVar80._0_4_)))),
                                        auVar94);
              uVar26 = vcmpps_avx512vl(local_280,auVar97,6);
              uVar73 = uVar73 & uVar26;
              bVar72 = (byte)uVar73;
              if (bVar72 != 0) {
                auVar169._0_4_ = auVar90._0_4_ * fVar145;
                auVar169._4_4_ = auVar90._4_4_ * fVar146;
                auVar169._8_4_ = auVar90._8_4_ * fVar147;
                auVar169._12_4_ = auVar90._12_4_ * fVar202;
                auVar169._16_4_ = auVar90._16_4_ * 0.0;
                auVar169._20_4_ = auVar90._20_4_ * 0.0;
                auVar169._24_4_ = auVar90._24_4_ * 0.0;
                auVar169._28_4_ = 0;
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = 0x3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar97 = vsubps_avx(auVar177,auVar169);
                auVar111._0_4_ =
                     (uint)(bVar63 & 1) * (int)auVar169._0_4_ |
                     (uint)!(bool)(bVar63 & 1) * auVar97._0_4_;
                bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar111._4_4_ = (uint)bVar13 * (int)auVar169._4_4_ | (uint)!bVar13 * auVar97._4_4_;
                bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar111._8_4_ = (uint)bVar13 * (int)auVar169._8_4_ | (uint)!bVar13 * auVar97._8_4_;
                bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar111._12_4_ =
                     (uint)bVar13 * (int)auVar169._12_4_ | (uint)!bVar13 * auVar97._12_4_;
                bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar111._16_4_ =
                     (uint)bVar13 * (int)auVar169._16_4_ | (uint)!bVar13 * auVar97._16_4_;
                bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar111._20_4_ =
                     (uint)bVar13 * (int)auVar169._20_4_ | (uint)!bVar13 * auVar97._20_4_;
                bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar111._24_4_ =
                     (uint)bVar13 * (int)auVar169._24_4_ | (uint)!bVar13 * auVar97._24_4_;
                auVar111._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar97._28_4_;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar111,auVar177,auVar34);
                local_260 = 0;
                local_25c = iVar8;
                local_250 = local_4b0._0_8_;
                uStack_248 = local_4b0._8_8_;
                local_240 = local_4d0._0_8_;
                uStack_238 = local_4d0._8_8_;
                local_230 = local_4e0._0_8_;
                uStack_228 = local_4e0._8_8_;
                local_220 = local_4c0;
                uStack_218 = uStack_4b8;
                if ((pGVar68->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar157 = 1.0 / auVar93._0_4_;
                  local_200[0] = fVar157 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar157 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar157 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar157 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar157 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar157 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar157 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar97 = vblendmps_avx512vl(auVar140,local_280);
                  auVar112._0_4_ =
                       (uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar112._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar112._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar112._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar112._16_4_ = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar112._20_4_ = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar112._24_4_ = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar73 >> 7,0);
                  auVar112._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar97 = vshufps_avx(auVar112,auVar112,0xb1);
                  auVar97 = vminps_avx(auVar112,auVar97);
                  auVar99 = vshufpd_avx(auVar97,auVar97,5);
                  auVar97 = vminps_avx(auVar97,auVar99);
                  auVar99 = vpermpd_avx2(auVar97,0x4e);
                  auVar97 = vminps_avx(auVar97,auVar99);
                  uVar148 = vcmpps_avx512vl(auVar112,auVar97,0);
                  uVar65 = (uint)uVar73;
                  if (((byte)uVar148 & bVar72) != 0) {
                    uVar65 = (uint)((byte)uVar148 & bVar72);
                  }
                  uVar27 = 0;
                  for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                    uVar27 = uVar27 + 1;
                  }
                  uVar64 = (ulong)uVar27;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_420 = local_280;
                    do {
                      local_494 = local_200[uVar64];
                      local_490 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar64 * 4);
                      local_510.context = context->user;
                      fVar145 = 1.0 - local_494;
                      fVar157 = fVar145 * fVar145 * -3.0;
                      auVar186 = ZEXT464((uint)fVar157);
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                                ZEXT416((uint)(local_494 * fVar145)),
                                                ZEXT416(0xc0000000));
                      auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar145)),
                                                ZEXT416((uint)(local_494 * local_494)),
                                                ZEXT416(0x40000000));
                      fVar145 = auVar80._0_4_ * 3.0;
                      fVar146 = auVar81._0_4_ * 3.0;
                      fVar147 = local_494 * local_494 * 3.0;
                      auVar192._0_4_ = fVar147 * (float)local_4c0._0_4_;
                      auVar192._4_4_ = fVar147 * (float)local_4c0._4_4_;
                      auVar192._8_4_ = fVar147 * (float)uStack_4b8;
                      auVar192._12_4_ = fVar147 * uStack_4b8._4_4_;
                      auVar193 = ZEXT1664(auVar192);
                      auVar167._4_4_ = fVar146;
                      auVar167._0_4_ = fVar146;
                      auVar167._8_4_ = fVar146;
                      auVar167._12_4_ = fVar146;
                      auVar80 = vfmadd132ps_fma(auVar167,auVar192,local_4e0);
                      auVar176._4_4_ = fVar145;
                      auVar176._0_4_ = fVar145;
                      auVar176._8_4_ = fVar145;
                      auVar176._12_4_ = fVar145;
                      auVar80 = vfmadd132ps_fma(auVar176,auVar80,local_4d0);
                      auVar168._4_4_ = fVar157;
                      auVar168._0_4_ = fVar157;
                      auVar168._8_4_ = fVar157;
                      auVar168._12_4_ = fVar157;
                      auVar80 = vfmadd132ps_fma(auVar168,auVar80,local_4b0);
                      local_4a0 = vmovlps_avx(auVar80);
                      local_498 = vextractps_avx(auVar80,2);
                      local_48c = (int)local_528;
                      local_488 = (int)local_530;
                      local_484 = (local_510.context)->instID[0];
                      local_480 = (local_510.context)->instPrimID[0];
                      local_534 = -1;
                      local_510.valid = &local_534;
                      local_510.geometryUserPtr = pGVar68->userPtr;
                      local_510.ray = (RTCRayN *)ray;
                      local_510.hit = (RTCHitN *)&local_4a0;
                      local_510.N = 1;
                      if (pGVar68->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01be9dc3:
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar186 = ZEXT1664(auVar186._0_16_);
                          auVar193 = ZEXT1664(auVar193._0_16_);
                          (*p_Var12)(&local_510);
                          auVar199 = ZEXT3264(local_420);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                          auVar217 = ZEXT1664(auVar80);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar215 = ZEXT1664(auVar80);
                          if (*local_510.valid == 0) goto LAB_01be9e77;
                        }
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                             *(float *)local_510.hit;
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_510.hit + 4);
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_510.hit + 8);
                        *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                        *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                        *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                        *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                        *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                        *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                      }
                      else {
                        auVar186 = ZEXT464((uint)fVar157);
                        auVar193 = ZEXT1664(auVar192);
                        (*pGVar68->intersectionFilterN)(&local_510);
                        auVar199 = ZEXT3264(local_420);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar217 = ZEXT1664(auVar80);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar215 = ZEXT1664(auVar80);
                        if (*local_510.valid != 0) goto LAB_01be9dc3;
LAB_01be9e77:
                        (ray->super_RayK<1>).tfar = (float)local_400._0_4_;
                      }
                      bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                      fVar157 = (ray->super_RayK<1>).tfar;
                      auVar40._4_4_ = fVar157;
                      auVar40._0_4_ = fVar157;
                      auVar40._8_4_ = fVar157;
                      auVar40._12_4_ = fVar157;
                      auVar40._16_4_ = fVar157;
                      auVar40._20_4_ = fVar157;
                      auVar40._24_4_ = fVar157;
                      auVar40._28_4_ = fVar157;
                      uVar148 = vcmpps_avx512vl(auVar199._0_32_,auVar40,2);
                      pre = local_520;
                      prim = local_518;
                      if ((bVar72 & (byte)uVar148) == 0) goto LAB_01be8ff5;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar72 = bVar72 & (byte)uVar148;
                      uVar73 = (ulong)bVar72;
                      auVar144._8_4_ = 0x7f800000;
                      auVar144._0_8_ = 0x7f8000007f800000;
                      auVar144._12_4_ = 0x7f800000;
                      auVar144._16_4_ = 0x7f800000;
                      auVar144._20_4_ = 0x7f800000;
                      auVar144._24_4_ = 0x7f800000;
                      auVar144._28_4_ = 0x7f800000;
                      auVar97 = vblendmps_avx512vl(auVar144,auVar199._0_32_);
                      auVar125._0_4_ =
                           (uint)(bVar72 & 1) * auVar97._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 1 & 1);
                      auVar125._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 2 & 1);
                      auVar125._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 3 & 1);
                      auVar125._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 4 & 1);
                      auVar125._16_4_ = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 5 & 1);
                      auVar125._20_4_ = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar72 >> 6 & 1);
                      auVar125._24_4_ = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar125._28_4_ =
                           (uint)(bVar72 >> 7) * auVar97._28_4_ |
                           (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                      auVar97 = vshufps_avx(auVar125,auVar125,0xb1);
                      auVar97 = vminps_avx(auVar125,auVar97);
                      auVar99 = vshufpd_avx(auVar97,auVar97,5);
                      auVar97 = vminps_avx(auVar97,auVar99);
                      auVar99 = vpermpd_avx2(auVar97,0x4e);
                      auVar97 = vminps_avx(auVar97,auVar99);
                      uVar148 = vcmpps_avx512vl(auVar125,auVar97,0);
                      bVar63 = (byte)uVar148 & bVar72;
                      if (bVar63 != 0) {
                        bVar72 = bVar63;
                      }
                      uVar70 = 0;
                      for (uVar66 = (uint)bVar72; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x80000000) {
                        uVar70 = uVar70 + 1;
                      }
                      uVar64 = (ulong)uVar70;
                    } while( true );
                  }
                  fVar157 = local_200[uVar64];
                  fVar145 = *(float *)(local_1e0 + uVar64 * 4);
                  fVar147 = 1.0 - fVar157;
                  fVar146 = fVar147 * fVar147 * -3.0;
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                            ZEXT416((uint)(fVar157 * fVar147)),ZEXT416(0xc0000000));
                  auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar157 * fVar147)),
                                            ZEXT416((uint)(fVar157 * fVar157)),ZEXT416(0x40000000));
                  fVar147 = auVar80._0_4_ * 3.0;
                  fVar202 = auVar81._0_4_ * 3.0;
                  fVar171 = fVar157 * fVar157 * 3.0;
                  auVar189._0_4_ = fVar171 * (float)local_4c0._0_4_;
                  auVar189._4_4_ = fVar171 * (float)local_4c0._4_4_;
                  auVar189._8_4_ = fVar171 * (float)uStack_4b8;
                  auVar189._12_4_ = fVar171 * uStack_4b8._4_4_;
                  auVar193 = ZEXT1664(auVar189);
                  auVar161._4_4_ = fVar202;
                  auVar161._0_4_ = fVar202;
                  auVar161._8_4_ = fVar202;
                  auVar161._12_4_ = fVar202;
                  auVar80 = vfmadd132ps_fma(auVar161,auVar189,local_4e0);
                  auVar173._4_4_ = fVar147;
                  auVar173._0_4_ = fVar147;
                  auVar173._8_4_ = fVar147;
                  auVar173._12_4_ = fVar147;
                  auVar80 = vfmadd132ps_fma(auVar173,auVar80,local_4d0);
                  auVar162._4_4_ = fVar146;
                  auVar162._0_4_ = fVar146;
                  auVar162._8_4_ = fVar146;
                  auVar162._12_4_ = fVar146;
                  auVar186 = ZEXT464((uint)*(float *)(local_1c0 + uVar64 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar64 * 4);
                  auVar80 = vfmadd132ps_fma(auVar162,auVar80,local_4b0);
                  uVar148 = vmovlps_avx(auVar80);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar148;
                  fVar146 = (float)vextractps_avx(auVar80,2);
                  (ray->Ng).field_0.field_0.z = fVar146;
                  ray->u = fVar157;
                  ray->v = fVar145;
                  ray->primID = uVar66;
                  ray->geomID = uVar70;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  pre = local_520;
                  prim = local_518;
                }
              }
            }
          }
        }
      }
LAB_01be8ff5:
      if (8 < iVar8) {
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = local_440._0_4_;
        local_420._0_4_ = local_440._0_4_;
        local_420._8_4_ = local_440._0_4_;
        local_420._12_4_ = local_440._0_4_;
        local_420._16_4_ = local_440._0_4_;
        local_420._20_4_ = local_440._0_4_;
        local_420._24_4_ = local_440._0_4_;
        local_420._28_4_ = local_440._0_4_;
        auVar141._8_4_ = 3;
        auVar141._0_8_ = 0x300000003;
        auVar141._12_4_ = 3;
        auVar141._16_4_ = 3;
        auVar141._20_4_ = 3;
        auVar141._24_4_ = 3;
        auVar141._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar141,local_3e0);
        local_100 = 1.0 / (float)local_460._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        lVar69 = 8;
LAB_01be9088:
        auVar97 = vpbroadcastd_avx512vl();
        auVar97 = vpor_avx2(auVar97,_DAT_01fe9900);
        uVar25 = vpcmpd_avx512vl(auVar97,local_400,1);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 * 4 + lVar28);
        auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar69 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar69 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar69 * 4);
        auVar194._0_4_ = auVar101._0_4_ * (float)local_3a0._0_4_;
        auVar194._4_4_ = auVar101._4_4_ * (float)local_3a0._4_4_;
        auVar194._8_4_ = auVar101._8_4_ * fStack_398;
        auVar194._12_4_ = auVar101._12_4_ * fStack_394;
        auVar194._16_4_ = auVar101._16_4_ * fStack_390;
        auVar194._20_4_ = auVar101._20_4_ * fStack_38c;
        auVar194._28_36_ = auVar193._28_36_;
        auVar194._24_4_ = auVar101._24_4_ * fStack_388;
        auVar193._0_4_ = auVar101._0_4_ * (float)local_3c0._0_4_;
        auVar193._4_4_ = auVar101._4_4_ * (float)local_3c0._4_4_;
        auVar193._8_4_ = auVar101._8_4_ * fStack_3b8;
        auVar193._12_4_ = auVar101._12_4_ * fStack_3b4;
        auVar193._16_4_ = auVar101._16_4_ * fStack_3b0;
        auVar193._20_4_ = auVar101._20_4_ * fStack_3ac;
        auVar193._28_36_ = auVar186._28_36_;
        auVar193._24_4_ = auVar101._24_4_ * fStack_3a8;
        auVar100 = vmulps_avx512vl(local_e0,auVar101);
        auVar86 = vfmadd231ps_avx512vl(auVar194._0_32_,auVar102,local_360);
        auVar87 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar102,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_c0);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_320);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_340);
        auVar88 = vfmadd231ps_avx512vl(auVar100,auVar99,local_a0);
        auVar80 = vfmadd231ps_fma(auVar86,auVar97,local_2e0);
        auVar193 = ZEXT1664(auVar80);
        auVar81 = vfmadd231ps_fma(auVar87,auVar97,local_300);
        auVar186 = ZEXT1664(auVar81);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 * 4 + lVar28);
        auVar86 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar69 * 4);
        auVar90 = vfmadd231ps_avx512vl(auVar88,auVar97,local_80);
        auVar87 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar69 * 4);
        auVar88 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar69 * 4);
        auVar200._0_4_ = auVar88._0_4_ * (float)local_3a0._0_4_;
        auVar200._4_4_ = auVar88._4_4_ * (float)local_3a0._4_4_;
        auVar200._8_4_ = auVar88._8_4_ * fStack_398;
        auVar200._12_4_ = auVar88._12_4_ * fStack_394;
        auVar200._16_4_ = auVar88._16_4_ * fStack_390;
        auVar200._20_4_ = auVar88._20_4_ * fStack_38c;
        auVar200._28_36_ = auVar199._28_36_;
        auVar200._24_4_ = auVar88._24_4_ * fStack_388;
        auVar46._4_4_ = auVar88._4_4_ * (float)local_3c0._4_4_;
        auVar46._0_4_ = auVar88._0_4_ * (float)local_3c0._0_4_;
        auVar46._8_4_ = auVar88._8_4_ * fStack_3b8;
        auVar46._12_4_ = auVar88._12_4_ * fStack_3b4;
        auVar46._16_4_ = auVar88._16_4_ * fStack_3b0;
        auVar46._20_4_ = auVar88._20_4_ * fStack_3ac;
        auVar46._24_4_ = auVar88._24_4_ * fStack_3a8;
        auVar46._28_4_ = uStack_3a4;
        auVar98 = vmulps_avx512vl(local_e0,auVar88);
        auVar89 = vfmadd231ps_avx512vl(auVar200._0_32_,auVar87,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar46,auVar87,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar87,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_320);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_340);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar86,local_a0);
        auVar77 = vfmadd231ps_fma(auVar89,auVar100,local_2e0);
        auVar199 = ZEXT1664(auVar77);
        auVar19 = vfmadd231ps_fma(auVar91,auVar100,local_300);
        auVar91 = vfmadd231ps_avx512vl(auVar98,auVar100,local_80);
        auVar92 = vmaxps_avx512vl(auVar90,auVar91);
        auVar98 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar80));
        auVar89 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar81));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar81),auVar98);
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar80),auVar89);
        auVar93 = vsubps_avx512vl(auVar93,auVar94);
        auVar94 = vmulps_avx512vl(auVar89,auVar89);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar98);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar94);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar148 = vcmpps_avx512vl(auVar93,auVar92,2);
        bVar72 = (byte)uVar25 & (byte)uVar148;
        if (bVar72 != 0) {
          auVar88 = vmulps_avx512vl(local_180,auVar88);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_160,auVar88);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_140,auVar87);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar86);
          auVar101 = vmulps_avx512vl(local_180,auVar101);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar102);
          auVar86 = vfmadd213ps_avx512vl(auVar97,local_120,auVar99);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar69 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar69 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar69 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar69 * 4);
          auVar87 = vmulps_avx512vl(_local_3a0,auVar101);
          auVar88 = vmulps_avx512vl(_local_3c0,auVar101);
          auVar101 = vmulps_avx512vl(local_180,auVar101);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_360);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_380);
          auVar102 = vfmadd231ps_avx512vl(auVar101,local_160,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar87,auVar99,local_320);
          auVar87 = vfmadd231ps_avx512vl(auVar88,auVar99,local_340);
          auVar99 = vfmadd231ps_avx512vl(auVar102,local_140,auVar99);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_2e0);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar97,local_300);
          auVar88 = vfmadd231ps_avx512vl(auVar99,local_120,auVar97);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar69 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar69 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar69 * 4);
          auVar92 = vmulps_avx512vl(_local_3a0,auVar102);
          auVar93 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar102 = vmulps_avx512vl(local_180,auVar102);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_360);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_380);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_160,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar69 * 4);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_320);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_340);
          auVar99 = vfmadd231ps_avx512vl(auVar102,local_140,auVar99);
          auVar102 = vfmadd231ps_avx512vl(auVar92,auVar97,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar97,local_300);
          auVar99 = vfmadd231ps_avx512vl(auVar99,local_120,auVar97);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar101,auVar93);
          vandps_avx512vl(auVar87,auVar93);
          auVar97 = vmaxps_avx(auVar93,auVar93);
          vandps_avx512vl(auVar88,auVar93);
          auVar97 = vmaxps_avx(auVar97,auVar93);
          uVar64 = vcmpps_avx512vl(auVar97,local_420,1);
          bVar13 = (bool)((byte)uVar64 & 1);
          auVar113._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar101._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar101._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar101._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar101._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar113._16_4_ = (float)((uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar101._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar113._20_4_ = (float)((uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar101._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar113._24_4_ = (float)((uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar101._24_4_)
          ;
          bVar13 = SUB81(uVar64 >> 7,0);
          auVar113._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar101._28_4_;
          bVar13 = (bool)((byte)uVar64 & 1);
          auVar114._0_4_ = (float)((uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar87._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar87._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar87._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar87._12_4_);
          bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar87._16_4_);
          bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar87._20_4_);
          bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar87._24_4_);
          bVar13 = SUB81(uVar64 >> 7,0);
          auVar114._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar87._28_4_;
          vandps_avx512vl(auVar102,auVar93);
          vandps_avx512vl(auVar92,auVar93);
          auVar97 = vmaxps_avx(auVar114,auVar114);
          vandps_avx512vl(auVar99,auVar93);
          auVar97 = vmaxps_avx(auVar97,auVar114);
          uVar64 = vcmpps_avx512vl(auVar97,local_420,1);
          bVar13 = (bool)((byte)uVar64 & 1);
          auVar115._0_4_ = (uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar102._0_4_;
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar115._4_4_ = (uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar102._4_4_;
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar115._8_4_ = (uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar102._8_4_;
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar115._12_4_ = (uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar102._12_4_;
          bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar115._16_4_ = (uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar102._16_4_;
          bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar115._20_4_ = (uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar102._20_4_;
          bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar115._24_4_ = (uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar102._24_4_;
          bVar13 = SUB81(uVar64 >> 7,0);
          auVar115._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar102._28_4_;
          bVar13 = (bool)((byte)uVar64 & 1);
          auVar116._0_4_ = (float)((uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar92._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar92._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar92._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar92._12_4_);
          bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar92._16_4_);
          bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar92._20_4_);
          bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar92._24_4_);
          bVar13 = SUB81(uVar64 >> 7,0);
          auVar116._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar92._28_4_;
          auVar205._8_4_ = 0x80000000;
          auVar205._0_8_ = 0x8000000080000000;
          auVar205._12_4_ = 0x80000000;
          auVar205._16_4_ = 0x80000000;
          auVar205._20_4_ = 0x80000000;
          auVar205._24_4_ = 0x80000000;
          auVar205._28_4_ = 0x80000000;
          auVar97 = vxorps_avx512vl(auVar115,auVar205);
          auVar76 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
          auVar99 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar76));
          auVar20 = vfmadd231ps_fma(auVar99,auVar114,auVar114);
          auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar20));
          auVar213._8_4_ = 0xbf000000;
          auVar213._0_8_ = 0xbf000000bf000000;
          auVar213._12_4_ = 0xbf000000;
          auVar213._16_4_ = 0xbf000000;
          auVar213._20_4_ = 0xbf000000;
          auVar213._24_4_ = 0xbf000000;
          auVar213._28_4_ = 0xbf000000;
          fVar157 = auVar99._0_4_;
          fVar145 = auVar99._4_4_;
          fVar146 = auVar99._8_4_;
          fVar147 = auVar99._12_4_;
          fVar202 = auVar99._16_4_;
          fVar171 = auVar99._20_4_;
          fVar74 = auVar99._24_4_;
          auVar47._4_4_ = fVar145 * fVar145 * fVar145 * auVar20._4_4_ * -0.5;
          auVar47._0_4_ = fVar157 * fVar157 * fVar157 * auVar20._0_4_ * -0.5;
          auVar47._8_4_ = fVar146 * fVar146 * fVar146 * auVar20._8_4_ * -0.5;
          auVar47._12_4_ = fVar147 * fVar147 * fVar147 * auVar20._12_4_ * -0.5;
          auVar47._16_4_ = fVar202 * fVar202 * fVar202 * -0.0;
          auVar47._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar47._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
          auVar47._28_4_ = auVar114._28_4_;
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar99 = vfmadd231ps_avx512vl(auVar47,auVar102,auVar99);
          auVar48._4_4_ = auVar114._4_4_ * auVar99._4_4_;
          auVar48._0_4_ = auVar114._0_4_ * auVar99._0_4_;
          auVar48._8_4_ = auVar114._8_4_ * auVar99._8_4_;
          auVar48._12_4_ = auVar114._12_4_ * auVar99._12_4_;
          auVar48._16_4_ = auVar114._16_4_ * auVar99._16_4_;
          auVar48._20_4_ = auVar114._20_4_ * auVar99._20_4_;
          auVar48._24_4_ = auVar114._24_4_ * auVar99._24_4_;
          auVar48._28_4_ = 0;
          auVar49._4_4_ = auVar99._4_4_ * -auVar113._4_4_;
          auVar49._0_4_ = auVar99._0_4_ * -auVar113._0_4_;
          auVar49._8_4_ = auVar99._8_4_ * -auVar113._8_4_;
          auVar49._12_4_ = auVar99._12_4_ * -auVar113._12_4_;
          auVar49._16_4_ = auVar99._16_4_ * -auVar113._16_4_;
          auVar49._20_4_ = auVar99._20_4_ * -auVar113._20_4_;
          auVar49._24_4_ = auVar99._24_4_ * -auVar113._24_4_;
          auVar49._28_4_ = auVar114._28_4_;
          auVar101 = vmulps_avx512vl(auVar99,ZEXT1632(auVar76));
          auVar88 = ZEXT1632(auVar76);
          auVar99 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar88);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,auVar116);
          auVar87 = vrsqrt14ps_avx512vl(auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar213);
          fVar157 = auVar87._0_4_;
          fVar145 = auVar87._4_4_;
          fVar146 = auVar87._8_4_;
          fVar147 = auVar87._12_4_;
          fVar202 = auVar87._16_4_;
          fVar171 = auVar87._20_4_;
          fVar74 = auVar87._24_4_;
          auVar50._4_4_ = fVar145 * fVar145 * fVar145 * auVar99._4_4_;
          auVar50._0_4_ = fVar157 * fVar157 * fVar157 * auVar99._0_4_;
          auVar50._8_4_ = fVar146 * fVar146 * fVar146 * auVar99._8_4_;
          auVar50._12_4_ = fVar147 * fVar147 * fVar147 * auVar99._12_4_;
          auVar50._16_4_ = fVar202 * fVar202 * fVar202 * auVar99._16_4_;
          auVar50._20_4_ = fVar171 * fVar171 * fVar171 * auVar99._20_4_;
          auVar50._24_4_ = fVar74 * fVar74 * fVar74 * auVar99._24_4_;
          auVar50._28_4_ = auVar99._28_4_;
          auVar99 = vfmadd231ps_avx512vl(auVar50,auVar102,auVar87);
          auVar51._4_4_ = auVar116._4_4_ * auVar99._4_4_;
          auVar51._0_4_ = auVar116._0_4_ * auVar99._0_4_;
          auVar51._8_4_ = auVar116._8_4_ * auVar99._8_4_;
          auVar51._12_4_ = auVar116._12_4_ * auVar99._12_4_;
          auVar51._16_4_ = auVar116._16_4_ * auVar99._16_4_;
          auVar51._20_4_ = auVar116._20_4_ * auVar99._20_4_;
          auVar51._24_4_ = auVar116._24_4_ * auVar99._24_4_;
          auVar51._28_4_ = auVar87._28_4_;
          auVar52._4_4_ = auVar99._4_4_ * auVar97._4_4_;
          auVar52._0_4_ = auVar99._0_4_ * auVar97._0_4_;
          auVar52._8_4_ = auVar99._8_4_ * auVar97._8_4_;
          auVar52._12_4_ = auVar99._12_4_ * auVar97._12_4_;
          auVar52._16_4_ = auVar99._16_4_ * auVar97._16_4_;
          auVar52._20_4_ = auVar99._20_4_ * auVar97._20_4_;
          auVar52._24_4_ = auVar99._24_4_ * auVar97._24_4_;
          auVar52._28_4_ = auVar97._28_4_;
          auVar97 = vmulps_avx512vl(auVar99,auVar88);
          auVar20 = vfmadd213ps_fma(auVar48,auVar90,ZEXT1632(auVar80));
          auVar78 = vfmadd213ps_fma(auVar49,auVar90,ZEXT1632(auVar81));
          auVar102 = vfmadd213ps_avx512vl(auVar101,auVar90,auVar86);
          auVar87 = vfmadd213ps_avx512vl(auVar51,auVar91,ZEXT1632(auVar77));
          auVar22 = vfnmadd213ps_fma(auVar48,auVar90,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar52,auVar91,ZEXT1632(auVar19));
          auVar79 = vfnmadd213ps_fma(auVar49,auVar90,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar97,auVar91,auVar100);
          auVar29 = vfnmadd231ps_fma(auVar86,auVar90,auVar101);
          auVar23 = vfnmadd213ps_fma(auVar51,auVar91,ZEXT1632(auVar77));
          auVar24 = vfnmadd213ps_fma(auVar52,auVar91,ZEXT1632(auVar19));
          auVar30 = vfnmadd231ps_fma(auVar100,auVar91,auVar97);
          auVar100 = vsubps_avx512vl(auVar87,ZEXT1632(auVar22));
          auVar97 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar79));
          auVar99 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar29));
          auVar53._4_4_ = auVar97._4_4_ * auVar29._4_4_;
          auVar53._0_4_ = auVar97._0_4_ * auVar29._0_4_;
          auVar53._8_4_ = auVar97._8_4_ * auVar29._8_4_;
          auVar53._12_4_ = auVar97._12_4_ * auVar29._12_4_;
          auVar53._16_4_ = auVar97._16_4_ * 0.0;
          auVar53._20_4_ = auVar97._20_4_ * 0.0;
          auVar53._24_4_ = auVar97._24_4_ * 0.0;
          auVar53._28_4_ = auVar101._28_4_;
          auVar77 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar79),auVar99);
          auVar54._4_4_ = auVar99._4_4_ * auVar22._4_4_;
          auVar54._0_4_ = auVar99._0_4_ * auVar22._0_4_;
          auVar54._8_4_ = auVar99._8_4_ * auVar22._8_4_;
          auVar54._12_4_ = auVar99._12_4_ * auVar22._12_4_;
          auVar54._16_4_ = auVar99._16_4_ * 0.0;
          auVar54._20_4_ = auVar99._20_4_ * 0.0;
          auVar54._24_4_ = auVar99._24_4_ * 0.0;
          auVar54._28_4_ = auVar99._28_4_;
          auVar19 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar29),auVar100);
          auVar55._4_4_ = auVar79._4_4_ * auVar100._4_4_;
          auVar55._0_4_ = auVar79._0_4_ * auVar100._0_4_;
          auVar55._8_4_ = auVar79._8_4_ * auVar100._8_4_;
          auVar55._12_4_ = auVar79._12_4_ * auVar100._12_4_;
          auVar55._16_4_ = auVar100._16_4_ * 0.0;
          auVar55._20_4_ = auVar100._20_4_ * 0.0;
          auVar55._24_4_ = auVar100._24_4_ * 0.0;
          auVar55._28_4_ = auVar100._28_4_;
          auVar21 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar22),auVar97);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar88,ZEXT1632(auVar19));
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar77));
          auVar93 = ZEXT1632(auVar76);
          uVar64 = vcmpps_avx512vl(auVar97,auVar93,2);
          bVar63 = (byte)uVar64;
          fVar127 = (float)((uint)(bVar63 & 1) * auVar20._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar23._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar129 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar23._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar132 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar23._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar133 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar23._12_4_);
          auVar88 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar132,CONCAT44(fVar129,fVar127))));
          fVar128 = (float)((uint)(bVar63 & 1) * auVar78._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar24._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar131 = (float)((uint)bVar13 * auVar78._4_4_ | (uint)!bVar13 * auVar24._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar130 = (float)((uint)bVar13 * auVar78._8_4_ | (uint)!bVar13 * auVar24._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar134 = (float)((uint)bVar13 * auVar78._12_4_ | (uint)!bVar13 * auVar24._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar130,CONCAT44(fVar131,fVar128))));
          auVar117._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar30._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar30._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar30._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar30._12_4_)
          ;
          fVar157 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_);
          auVar117._16_4_ = fVar157;
          fVar145 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_);
          auVar117._20_4_ = fVar145;
          fVar146 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_);
          auVar117._24_4_ = fVar146;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar102._28_4_;
          auVar117._28_4_ = iVar1;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar87);
          auVar118._0_4_ =
               (uint)(bVar63 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar77._0_4_;
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar77._4_4_;
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar77._8_4_;
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar77._12_4_;
          auVar118._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar97._16_4_;
          auVar118._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar97._20_4_;
          auVar118._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar97._24_4_;
          auVar118._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80));
          auVar119._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar20._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar20._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar20._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar20._12_4_);
          fVar171 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar97._16_4_);
          auVar119._16_4_ = fVar171;
          fVar147 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar97._20_4_);
          auVar119._20_4_ = fVar147;
          fVar202 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar97._24_4_);
          auVar119._24_4_ = fVar202;
          auVar119._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar81));
          auVar120._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar78._0_4_);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar78._4_4_);
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar78._8_4_);
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar78._12_4_);
          fVar74 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar97._16_4_);
          auVar120._16_4_ = fVar74;
          fVar75 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar97._20_4_);
          auVar120._20_4_ = fVar75;
          fVar126 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar97._24_4_);
          auVar120._24_4_ = fVar126;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar97._28_4_;
          auVar120._28_4_ = iVar2;
          auVar121._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar87._0_4_;
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar13 * (int)auVar22._4_4_ | (uint)!bVar13 * auVar87._4_4_;
          bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar13 * (int)auVar22._8_4_ | (uint)!bVar13 * auVar87._8_4_;
          bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar13 * (int)auVar22._12_4_ | (uint)!bVar13 * auVar87._12_4_;
          auVar121._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar87._16_4_;
          auVar121._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar87._20_4_;
          auVar121._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar87._24_4_;
          auVar121._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar87._28_4_;
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar87 = vsubps_avx512vl(auVar121,auVar88);
          auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar79._12_4_ |
                                                  (uint)!bVar17 * auVar80._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar79._8_4_ |
                                                           (uint)!bVar15 * auVar80._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar79._4_4_ |
                                                                    (uint)!bVar13 * auVar80._4_4_,
                                                                    (uint)(bVar63 & 1) *
                                                                    (int)auVar79._0_4_ |
                                                                    (uint)!(bool)(bVar63 & 1) *
                                                                    auVar80._0_4_)))),auVar98);
          auVar193 = ZEXT3264(auVar99);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar29._12_4_ |
                                                   (uint)!bVar18 * auVar81._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar29._8_4_ |
                                                            (uint)!bVar16 * auVar81._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar29._4_4_ |
                                                                     (uint)!bVar14 * auVar81._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar29._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar81._0_4_)))),auVar117);
          auVar101 = vsubps_avx(auVar88,auVar118);
          auVar199 = ZEXT3264(auVar101);
          auVar100 = vsubps_avx(auVar98,auVar119);
          auVar86 = vsubps_avx(auVar117,auVar120);
          auVar56._4_4_ = auVar102._4_4_ * fVar129;
          auVar56._0_4_ = auVar102._0_4_ * fVar127;
          auVar56._8_4_ = auVar102._8_4_ * fVar132;
          auVar56._12_4_ = auVar102._12_4_ * fVar133;
          auVar56._16_4_ = auVar102._16_4_ * 0.0;
          auVar56._20_4_ = auVar102._20_4_ * 0.0;
          auVar56._24_4_ = auVar102._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar56,auVar117,auVar87);
          auVar178._0_4_ = fVar128 * auVar87._0_4_;
          auVar178._4_4_ = fVar131 * auVar87._4_4_;
          auVar178._8_4_ = fVar130 * auVar87._8_4_;
          auVar178._12_4_ = fVar134 * auVar87._12_4_;
          auVar178._16_4_ = auVar87._16_4_ * 0.0;
          auVar178._20_4_ = auVar87._20_4_ * 0.0;
          auVar178._24_4_ = auVar87._24_4_ * 0.0;
          auVar178._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar178,auVar88,auVar99);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,ZEXT1632(auVar80));
          auVar184._0_4_ = auVar99._0_4_ * auVar117._0_4_;
          auVar184._4_4_ = auVar99._4_4_ * auVar117._4_4_;
          auVar184._8_4_ = auVar99._8_4_ * auVar117._8_4_;
          auVar184._12_4_ = auVar99._12_4_ * auVar117._12_4_;
          auVar184._16_4_ = auVar99._16_4_ * fVar157;
          auVar184._20_4_ = auVar99._20_4_ * fVar145;
          auVar184._24_4_ = auVar99._24_4_ * fVar146;
          auVar184._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar184,auVar98,auVar102);
          auVar89 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar80));
          auVar97 = vmulps_avx512vl(auVar86,auVar118);
          auVar97 = vfmsub231ps_avx512vl(auVar97,auVar101,auVar120);
          auVar57._4_4_ = auVar100._4_4_ * auVar120._4_4_;
          auVar57._0_4_ = auVar100._0_4_ * auVar120._0_4_;
          auVar57._8_4_ = auVar100._8_4_ * auVar120._8_4_;
          auVar57._12_4_ = auVar100._12_4_ * auVar120._12_4_;
          auVar57._16_4_ = auVar100._16_4_ * fVar74;
          auVar57._20_4_ = auVar100._20_4_ * fVar75;
          auVar57._24_4_ = auVar100._24_4_ * fVar126;
          auVar57._28_4_ = iVar2;
          auVar80 = vfmsub231ps_fma(auVar57,auVar119,auVar86);
          auVar185._0_4_ = auVar119._0_4_ * auVar101._0_4_;
          auVar185._4_4_ = auVar119._4_4_ * auVar101._4_4_;
          auVar185._8_4_ = auVar119._8_4_ * auVar101._8_4_;
          auVar185._12_4_ = auVar119._12_4_ * auVar101._12_4_;
          auVar185._16_4_ = fVar171 * auVar101._16_4_;
          auVar185._20_4_ = fVar147 * auVar101._20_4_;
          auVar185._24_4_ = fVar202 * auVar101._24_4_;
          auVar185._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar185,auVar100,auVar118);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,auVar97);
          auVar92 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar80));
          auVar186 = ZEXT3264(auVar92);
          auVar97 = vmaxps_avx(auVar89,auVar92);
          uVar148 = vcmpps_avx512vl(auVar97,auVar93,2);
          bVar72 = bVar72 & (byte)uVar148;
          if (bVar72 != 0) {
            auVar58._4_4_ = auVar86._4_4_ * auVar99._4_4_;
            auVar58._0_4_ = auVar86._0_4_ * auVar99._0_4_;
            auVar58._8_4_ = auVar86._8_4_ * auVar99._8_4_;
            auVar58._12_4_ = auVar86._12_4_ * auVar99._12_4_;
            auVar58._16_4_ = auVar86._16_4_ * auVar99._16_4_;
            auVar58._20_4_ = auVar86._20_4_ * auVar99._20_4_;
            auVar58._24_4_ = auVar86._24_4_ * auVar99._24_4_;
            auVar58._28_4_ = auVar97._28_4_;
            auVar19 = vfmsub231ps_fma(auVar58,auVar100,auVar102);
            auVar59._4_4_ = auVar102._4_4_ * auVar101._4_4_;
            auVar59._0_4_ = auVar102._0_4_ * auVar101._0_4_;
            auVar59._8_4_ = auVar102._8_4_ * auVar101._8_4_;
            auVar59._12_4_ = auVar102._12_4_ * auVar101._12_4_;
            auVar59._16_4_ = auVar102._16_4_ * auVar101._16_4_;
            auVar59._20_4_ = auVar102._20_4_ * auVar101._20_4_;
            auVar59._24_4_ = auVar102._24_4_ * auVar101._24_4_;
            auVar59._28_4_ = auVar102._28_4_;
            auVar77 = vfmsub231ps_fma(auVar59,auVar87,auVar86);
            auVar60._4_4_ = auVar100._4_4_ * auVar87._4_4_;
            auVar60._0_4_ = auVar100._0_4_ * auVar87._0_4_;
            auVar60._8_4_ = auVar100._8_4_ * auVar87._8_4_;
            auVar60._12_4_ = auVar100._12_4_ * auVar87._12_4_;
            auVar60._16_4_ = auVar100._16_4_ * auVar87._16_4_;
            auVar60._20_4_ = auVar100._20_4_ * auVar87._20_4_;
            auVar60._24_4_ = auVar100._24_4_ * auVar87._24_4_;
            auVar60._28_4_ = auVar100._28_4_;
            auVar20 = vfmsub231ps_fma(auVar60,auVar101,auVar99);
            auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar20));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar19),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar35._16_4_ = 0x3f800000;
            auVar35._20_4_ = 0x3f800000;
            auVar35._24_4_ = 0x3f800000;
            auVar35._28_4_ = 0x3f800000;
            auVar99 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar81),auVar35);
            auVar80 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
            auVar193 = ZEXT1664(auVar80);
            auVar61._4_4_ = auVar20._4_4_ * auVar117._4_4_;
            auVar61._0_4_ = auVar20._0_4_ * auVar117._0_4_;
            auVar61._8_4_ = auVar20._8_4_ * auVar117._8_4_;
            auVar61._12_4_ = auVar20._12_4_ * auVar117._12_4_;
            auVar61._16_4_ = fVar157 * 0.0;
            auVar61._20_4_ = fVar145 * 0.0;
            auVar61._24_4_ = fVar146 * 0.0;
            auVar61._28_4_ = iVar1;
            auVar77 = vfmadd231ps_fma(auVar61,auVar98,ZEXT1632(auVar77));
            auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar88,ZEXT1632(auVar19));
            fVar145 = auVar80._0_4_;
            fVar146 = auVar80._4_4_;
            fVar147 = auVar80._8_4_;
            fVar202 = auVar80._12_4_;
            local_280._28_4_ = auVar97._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar77._12_4_ * fVar202,
                                    CONCAT48(auVar77._8_4_ * fVar147,
                                             CONCAT44(auVar77._4_4_ * fVar146,
                                                      auVar77._0_4_ * fVar145))));
            auVar199 = ZEXT3264(local_280);
            uVar148 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar157 = (ray->super_RayK<1>).tfar;
            auVar36._4_4_ = fVar157;
            auVar36._0_4_ = fVar157;
            auVar36._8_4_ = fVar157;
            auVar36._12_4_ = fVar157;
            auVar36._16_4_ = fVar157;
            auVar36._20_4_ = fVar157;
            auVar36._24_4_ = fVar157;
            auVar36._28_4_ = fVar157;
            uVar25 = vcmpps_avx512vl(local_280,auVar36,2);
            bVar72 = (byte)uVar148 & (byte)uVar25 & bVar72;
            if (bVar72 != 0) {
              uVar73 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar73 = bVar72 & uVar73;
              if ((char)uVar73 != '\0') {
                fVar157 = auVar89._0_4_ * fVar145;
                fVar171 = auVar89._4_4_ * fVar146;
                auVar62._4_4_ = fVar171;
                auVar62._0_4_ = fVar157;
                fVar74 = auVar89._8_4_ * fVar147;
                auVar62._8_4_ = fVar74;
                fVar75 = auVar89._12_4_ * fVar202;
                auVar62._12_4_ = fVar75;
                fVar126 = auVar89._16_4_ * 0.0;
                auVar62._16_4_ = fVar126;
                fVar127 = auVar89._20_4_ * 0.0;
                auVar62._20_4_ = fVar127;
                fVar128 = auVar89._24_4_ * 0.0;
                auVar62._24_4_ = fVar128;
                auVar62._28_4_ = auVar89._28_4_;
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar97 = vsubps_avx(auVar170,auVar62);
                local_2c0._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar157 |
                            (uint)!(bool)(bVar63 & 1) * auVar97._0_4_);
                bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar171 | (uint)!bVar13 * auVar97._4_4_);
                bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar74 | (uint)!bVar13 * auVar97._8_4_);
                bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar75 | (uint)!bVar13 * auVar97._12_4_);
                bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar126 | (uint)!bVar13 * auVar97._16_4_);
                bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar127 | (uint)!bVar13 * auVar97._20_4_);
                bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar128 | (uint)!bVar13 * auVar97._24_4_);
                bVar13 = SUB81(uVar64 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar97._28_4_);
                auVar97 = vsubps_avx(auVar91,auVar90);
                auVar80 = vfmadd213ps_fma(auVar97,local_2c0,auVar90);
                fVar157 = pre->depth_scale;
                auVar37._4_4_ = fVar157;
                auVar37._0_4_ = fVar157;
                auVar37._8_4_ = fVar157;
                auVar37._12_4_ = fVar157;
                auVar37._16_4_ = fVar157;
                auVar37._20_4_ = fVar157;
                auVar37._24_4_ = fVar157;
                auVar37._28_4_ = fVar157;
                auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                             CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                      CONCAT44(auVar80._4_4_ +
                                                                               auVar80._4_4_,
                                                                               auVar80._0_4_ +
                                                                               auVar80._0_4_)))),
                                          auVar37);
                uVar26 = vcmpps_avx512vl(local_280,auVar97,6);
                uVar73 = uVar73 & uVar26;
                bVar72 = (byte)uVar73;
                if (bVar72 != 0) {
                  auVar156._0_4_ = auVar92._0_4_ * fVar145;
                  auVar156._4_4_ = auVar92._4_4_ * fVar146;
                  auVar156._8_4_ = auVar92._8_4_ * fVar147;
                  auVar156._12_4_ = auVar92._12_4_ * fVar202;
                  auVar156._16_4_ = auVar92._16_4_ * 0.0;
                  auVar156._20_4_ = auVar92._20_4_ * 0.0;
                  auVar156._24_4_ = auVar92._24_4_ * 0.0;
                  auVar156._28_4_ = 0;
                  auVar179._8_4_ = 0x3f800000;
                  auVar179._0_8_ = 0x3f8000003f800000;
                  auVar179._12_4_ = 0x3f800000;
                  auVar179._16_4_ = 0x3f800000;
                  auVar179._20_4_ = 0x3f800000;
                  auVar179._24_4_ = 0x3f800000;
                  auVar179._28_4_ = 0x3f800000;
                  auVar97 = vsubps_avx(auVar179,auVar156);
                  auVar122._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar156._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar97._0_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar122._4_4_ =
                       (uint)bVar13 * (int)auVar156._4_4_ | (uint)!bVar13 * auVar97._4_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar122._8_4_ =
                       (uint)bVar13 * (int)auVar156._8_4_ | (uint)!bVar13 * auVar97._8_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar122._12_4_ =
                       (uint)bVar13 * (int)auVar156._12_4_ | (uint)!bVar13 * auVar97._12_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar122._16_4_ =
                       (uint)bVar13 * (int)auVar156._16_4_ | (uint)!bVar13 * auVar97._16_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar122._20_4_ =
                       (uint)bVar13 * (int)auVar156._20_4_ | (uint)!bVar13 * auVar97._20_4_;
                  bVar13 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar122._24_4_ =
                       (uint)bVar13 * (int)auVar156._24_4_ | (uint)!bVar13 * auVar97._24_4_;
                  auVar122._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar97._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar122,auVar179,auVar38);
                  local_260 = (int)lVar69;
                  local_25c = iVar8;
                  local_250 = local_4b0._0_8_;
                  uStack_248 = local_4b0._8_8_;
                  local_240 = local_4d0._0_8_;
                  uStack_238 = local_4d0._8_8_;
                  local_230 = local_4e0._0_8_;
                  uStack_228 = local_4e0._8_8_;
                  local_220 = local_4c0;
                  uStack_218 = uStack_4b8;
                  pGVar68 = (context->scene->geometries).items[local_530].ptr;
                  if ((pGVar68->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar80 = vcvtsi2ss_avx512f(auVar76,(int)lVar69);
                    fVar157 = auVar80._0_4_;
                    local_200[0] = (fVar157 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar157 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar157 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar157 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar157 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar157 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar157 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar157 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar142._8_4_ = 0x7f800000;
                    auVar142._0_8_ = 0x7f8000007f800000;
                    auVar142._12_4_ = 0x7f800000;
                    auVar142._16_4_ = 0x7f800000;
                    auVar142._20_4_ = 0x7f800000;
                    auVar142._24_4_ = 0x7f800000;
                    auVar142._28_4_ = 0x7f800000;
                    auVar97 = vblendmps_avx512vl(auVar142,local_280);
                    auVar123._0_4_ =
                         (uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000
                    ;
                    bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar123._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar123._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar123._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar123._16_4_ = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar123._20_4_ = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar123._24_4_ = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar73 >> 7,0);
                    auVar123._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar97 = vshufps_avx(auVar123,auVar123,0xb1);
                    auVar97 = vminps_avx(auVar123,auVar97);
                    auVar99 = vshufpd_avx(auVar97,auVar97,5);
                    auVar97 = vminps_avx(auVar97,auVar99);
                    auVar99 = vpermpd_avx2(auVar97,0x4e);
                    auVar97 = vminps_avx(auVar97,auVar99);
                    uVar148 = vcmpps_avx512vl(auVar123,auVar97,0);
                    uVar70 = (uint)uVar73;
                    if (((byte)uVar148 & bVar72) != 0) {
                      uVar70 = (uint)((byte)uVar148 & bVar72);
                    }
                    uVar66 = 0;
                    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                      uVar66 = uVar66 + 1;
                    }
                    uVar64 = (ulong)uVar66;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar68;
                      do {
                        local_494 = local_200[uVar64];
                        local_490 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar64 * 4);
                        local_510.context = context->user;
                        fVar145 = 1.0 - local_494;
                        fVar157 = fVar145 * fVar145 * -3.0;
                        auVar186 = ZEXT464((uint)fVar157);
                        auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                                  ZEXT416((uint)(local_494 * fVar145)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar145)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar145 = auVar80._0_4_ * 3.0;
                        fVar146 = auVar81._0_4_ * 3.0;
                        fVar147 = local_494 * local_494 * 3.0;
                        auVar191._0_4_ = fVar147 * (float)local_4c0._0_4_;
                        auVar191._4_4_ = fVar147 * (float)local_4c0._4_4_;
                        auVar191._8_4_ = fVar147 * (float)uStack_4b8;
                        auVar191._12_4_ = fVar147 * uStack_4b8._4_4_;
                        auVar193 = ZEXT1664(auVar191);
                        auVar165._4_4_ = fVar146;
                        auVar165._0_4_ = fVar146;
                        auVar165._8_4_ = fVar146;
                        auVar165._12_4_ = fVar146;
                        auVar80 = vfmadd132ps_fma(auVar165,auVar191,local_4e0);
                        auVar175._4_4_ = fVar145;
                        auVar175._0_4_ = fVar145;
                        auVar175._8_4_ = fVar145;
                        auVar175._12_4_ = fVar145;
                        auVar80 = vfmadd132ps_fma(auVar175,auVar80,local_4d0);
                        auVar166._4_4_ = fVar157;
                        auVar166._0_4_ = fVar157;
                        auVar166._8_4_ = fVar157;
                        auVar166._12_4_ = fVar157;
                        auVar80 = vfmadd132ps_fma(auVar166,auVar80,local_4b0);
                        local_4a0 = vmovlps_avx(auVar80);
                        local_498 = vextractps_avx(auVar80,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_530;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_534 = -1;
                        local_510.valid = &local_534;
                        local_510.geometryUserPtr = pGVar68->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar68->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01be9ab3:
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            (*p_Var12)(&local_510);
                            auVar199 = ZEXT3264(local_460);
                            pGVar68 = local_468;
                            if (*local_510.valid == 0) goto LAB_01be9b50;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar186 = ZEXT464((uint)fVar157);
                          auVar193 = ZEXT1664(auVar191);
                          (*pGVar68->intersectionFilterN)(&local_510);
                          auVar199 = ZEXT3264(local_460);
                          pGVar68 = local_468;
                          if (*local_510.valid != 0) goto LAB_01be9ab3;
LAB_01be9b50:
                          (ray->super_RayK<1>).tfar = (float)local_440._0_4_;
                          pGVar68 = local_468;
                        }
                        bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                        fVar157 = (ray->super_RayK<1>).tfar;
                        auVar39._4_4_ = fVar157;
                        auVar39._0_4_ = fVar157;
                        auVar39._8_4_ = fVar157;
                        auVar39._12_4_ = fVar157;
                        auVar39._16_4_ = fVar157;
                        auVar39._20_4_ = fVar157;
                        auVar39._24_4_ = fVar157;
                        auVar39._28_4_ = fVar157;
                        uVar148 = vcmpps_avx512vl(auVar199._0_32_,auVar39,2);
                        if ((bVar72 & (byte)uVar148) == 0) goto LAB_01be9bf3;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar72 = bVar72 & (byte)uVar148;
                        uVar73 = (ulong)bVar72;
                        auVar143._8_4_ = 0x7f800000;
                        auVar143._0_8_ = 0x7f8000007f800000;
                        auVar143._12_4_ = 0x7f800000;
                        auVar143._16_4_ = 0x7f800000;
                        auVar143._20_4_ = 0x7f800000;
                        auVar143._24_4_ = 0x7f800000;
                        auVar143._28_4_ = 0x7f800000;
                        auVar97 = vblendmps_avx512vl(auVar143,auVar199._0_32_);
                        auVar124._0_4_ =
                             (uint)(bVar72 & 1) * auVar97._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 1 & 1);
                        auVar124._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 2 & 1);
                        auVar124._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 3 & 1);
                        auVar124._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar72 >> 4 & 1);
                        auVar124._16_4_ = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar72 >> 5 & 1);
                        auVar124._20_4_ = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar72 >> 6 & 1);
                        auVar124._24_4_ = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        auVar124._28_4_ =
                             (uint)(bVar72 >> 7) * auVar97._28_4_ |
                             (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                        auVar97 = vshufps_avx(auVar124,auVar124,0xb1);
                        auVar97 = vminps_avx(auVar124,auVar97);
                        auVar99 = vshufpd_avx(auVar97,auVar97,5);
                        auVar97 = vminps_avx(auVar97,auVar99);
                        auVar99 = vpermpd_avx2(auVar97,0x4e);
                        auVar97 = vminps_avx(auVar97,auVar99);
                        uVar148 = vcmpps_avx512vl(auVar124,auVar97,0);
                        bVar63 = (byte)uVar148 & bVar72;
                        if (bVar63 != 0) {
                          bVar72 = bVar63;
                        }
                        uVar70 = 0;
                        for (uVar66 = (uint)bVar72; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x80000000) {
                          uVar70 = uVar70 + 1;
                        }
                        uVar64 = (ulong)uVar70;
                      } while( true );
                    }
                    fVar157 = local_200[uVar64];
                    fVar145 = *(float *)(local_1e0 + uVar64 * 4);
                    fVar147 = 1.0 - fVar157;
                    fVar146 = fVar147 * fVar147 * -3.0;
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                              ZEXT416((uint)(fVar157 * fVar147)),ZEXT416(0xc0000000)
                                             );
                    auVar81 = vfmsub132ss_fma(ZEXT416((uint)(fVar157 * fVar147)),
                                              ZEXT416((uint)(fVar157 * fVar157)),ZEXT416(0x40000000)
                                             );
                    fVar147 = auVar80._0_4_ * 3.0;
                    fVar202 = auVar81._0_4_ * 3.0;
                    fVar171 = fVar157 * fVar157 * 3.0;
                    auVar190._0_4_ = fVar171 * (float)local_4c0._0_4_;
                    auVar190._4_4_ = fVar171 * (float)local_4c0._4_4_;
                    auVar190._8_4_ = fVar171 * (float)uStack_4b8;
                    auVar190._12_4_ = fVar171 * uStack_4b8._4_4_;
                    auVar193 = ZEXT1664(auVar190);
                    auVar163._4_4_ = fVar202;
                    auVar163._0_4_ = fVar202;
                    auVar163._8_4_ = fVar202;
                    auVar163._12_4_ = fVar202;
                    auVar80 = vfmadd132ps_fma(auVar163,auVar190,local_4e0);
                    auVar174._4_4_ = fVar147;
                    auVar174._0_4_ = fVar147;
                    auVar174._8_4_ = fVar147;
                    auVar174._12_4_ = fVar147;
                    auVar80 = vfmadd132ps_fma(auVar174,auVar80,local_4d0);
                    auVar164._4_4_ = fVar146;
                    auVar164._0_4_ = fVar146;
                    auVar164._8_4_ = fVar146;
                    auVar164._12_4_ = fVar146;
                    auVar186 = ZEXT464((uint)*(float *)(local_1c0 + uVar64 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar64 * 4);
                    auVar80 = vfmadd132ps_fma(auVar164,auVar80,local_4b0);
                    uVar148 = vmovlps_avx(auVar80);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar148;
                    fVar146 = (float)vextractps_avx(auVar80,2);
                    (ray->Ng).field_0.field_0.z = fVar146;
                    ray->u = fVar157;
                    ray->v = fVar145;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_530;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01be9913;
      }
LAB_01be8ffb:
      fVar157 = (ray->super_RayK<1>).tfar;
      auVar31._4_4_ = fVar157;
      auVar31._0_4_ = fVar157;
      auVar31._8_4_ = fVar157;
      auVar31._12_4_ = fVar157;
      uVar148 = vcmpps_avx512vl(local_190,auVar31,2);
      uVar70 = (uint)uVar71 & (uint)uVar71 + 0xf & (uint)uVar148;
      uVar71 = (ulong)uVar70;
    } while (uVar70 != 0);
  }
  return;
LAB_01be9bf3:
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar215 = ZEXT1664(auVar80);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar217 = ZEXT1664(auVar80);
  pre = local_520;
  prim = local_518;
LAB_01be9913:
  lVar69 = lVar69 + 8;
  if (iVar8 <= (int)lVar69) goto LAB_01be8ffb;
  goto LAB_01be9088;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }